

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  code *pcVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  long lVar78;
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  uint uVar93;
  ulong uVar94;
  uint uVar95;
  ulong uVar96;
  LinearSpace3fa *pLVar97;
  Primitive *pPVar98;
  long lVar99;
  ulong uVar100;
  undefined4 uVar101;
  undefined8 uVar102;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar103 [16];
  float fVar117;
  float fVar119;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar120;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar121;
  float fVar141;
  vint4 bi_1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar159 [64];
  vint4 ai;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar185;
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined4 uVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined4 uVar205;
  float fVar206;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined1 local_790 [16];
  LinearSpace3fa *local_778;
  Precalculations *local_770;
  Primitive *local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 (*local_6a8) [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [8];
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [2] [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar100 = (ulong)(byte)PVar8;
  lVar78 = uVar100 * 0x19;
  fVar206 = *(float *)(prim + lVar78 + 0x12);
  auVar165 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar165 = vinsertps_avx(auVar165,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar165 = vsubps_avx(auVar165,*(undefined1 (*) [16])(prim + lVar78 + 6));
  auVar103._0_4_ = fVar206 * auVar165._0_4_;
  auVar103._4_4_ = fVar206 * auVar165._4_4_;
  auVar103._8_4_ = fVar206 * auVar165._8_4_;
  auVar103._12_4_ = fVar206 * auVar165._12_4_;
  auVar178._0_4_ = fVar206 * auVar13._0_4_;
  auVar178._4_4_ = fVar206 * auVar13._4_4_;
  auVar178._8_4_ = fVar206 * auVar13._8_4_;
  auVar178._12_4_ = fVar206 * auVar13._12_4_;
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar100 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  uVar94 = (ulong)(uint)((int)(uVar100 * 9) * 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar100 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar94 = (ulong)(uint)((int)(uVar100 * 5) << 2);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar222._4_4_ = auVar178._0_4_;
  auVar222._0_4_ = auVar178._0_4_;
  auVar222._8_4_ = auVar178._0_4_;
  auVar222._12_4_ = auVar178._0_4_;
  auVar123 = vshufps_avx(auVar178,auVar178,0x55);
  auVar104 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar206 = auVar104._0_4_;
  auVar207._0_4_ = fVar206 * auVar15._0_4_;
  fVar117 = auVar104._4_4_;
  auVar207._4_4_ = fVar117 * auVar15._4_4_;
  fVar118 = auVar104._8_4_;
  auVar207._8_4_ = fVar118 * auVar15._8_4_;
  fVar119 = auVar104._12_4_;
  auVar207._12_4_ = fVar119 * auVar15._12_4_;
  auVar203._0_4_ = auVar168._0_4_ * fVar206;
  auVar203._4_4_ = auVar168._4_4_ * fVar117;
  auVar203._8_4_ = auVar168._8_4_ * fVar118;
  auVar203._12_4_ = auVar168._12_4_ * fVar119;
  auVar193._0_4_ = auVar142._0_4_ * fVar206;
  auVar193._4_4_ = auVar142._4_4_ * fVar117;
  auVar193._8_4_ = auVar142._8_4_ * fVar118;
  auVar193._12_4_ = auVar142._12_4_ * fVar119;
  auVar104 = vfmadd231ps_fma(auVar207,auVar123,auVar13);
  auVar124 = vfmadd231ps_fma(auVar203,auVar123,auVar17);
  auVar123 = vfmadd231ps_fma(auVar193,auVar105,auVar123);
  auVar155 = vfmadd231ps_fma(auVar104,auVar222,auVar165);
  auVar124 = vfmadd231ps_fma(auVar124,auVar222,auVar16);
  auVar161 = vfmadd231ps_fma(auVar123,auVar106,auVar222);
  auVar223._4_4_ = auVar103._0_4_;
  auVar223._0_4_ = auVar103._0_4_;
  auVar223._8_4_ = auVar103._0_4_;
  auVar223._12_4_ = auVar103._0_4_;
  auVar123 = vshufps_avx(auVar103,auVar103,0x55);
  auVar104 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar206 = auVar104._0_4_;
  auVar179._0_4_ = fVar206 * auVar15._0_4_;
  fVar117 = auVar104._4_4_;
  auVar179._4_4_ = fVar117 * auVar15._4_4_;
  fVar118 = auVar104._8_4_;
  auVar179._8_4_ = fVar118 * auVar15._8_4_;
  fVar119 = auVar104._12_4_;
  auVar179._12_4_ = fVar119 * auVar15._12_4_;
  auVar122._0_4_ = auVar168._0_4_ * fVar206;
  auVar122._4_4_ = auVar168._4_4_ * fVar117;
  auVar122._8_4_ = auVar168._8_4_ * fVar118;
  auVar122._12_4_ = auVar168._12_4_ * fVar119;
  auVar104._0_4_ = auVar142._0_4_ * fVar206;
  auVar104._4_4_ = auVar142._4_4_ * fVar117;
  auVar104._8_4_ = auVar142._8_4_ * fVar118;
  auVar104._12_4_ = auVar142._12_4_ * fVar119;
  auVar13 = vfmadd231ps_fma(auVar179,auVar123,auVar13);
  auVar15 = vfmadd231ps_fma(auVar122,auVar123,auVar17);
  auVar17 = vfmadd231ps_fma(auVar104,auVar123,auVar105);
  auVar168 = vfmadd231ps_fma(auVar13,auVar223,auVar165);
  auVar105 = vfmadd231ps_fma(auVar15,auVar223,auVar16);
  auVar142 = vfmadd231ps_fma(auVar17,auVar223,auVar106);
  local_2b0._8_4_ = 0x7fffffff;
  local_2b0._0_8_ = 0x7fffffff7fffffff;
  local_2b0._12_4_ = 0x7fffffff;
  auVar165 = vandps_avx(auVar155,local_2b0);
  auVar160._8_4_ = 0x219392ef;
  auVar160._0_8_ = 0x219392ef219392ef;
  auVar160._12_4_ = 0x219392ef;
  auVar165 = vcmpps_avx(auVar165,auVar160,1);
  auVar13 = vblendvps_avx(auVar155,auVar160,auVar165);
  auVar165 = vandps_avx(auVar124,local_2b0);
  auVar165 = vcmpps_avx(auVar165,auVar160,1);
  auVar15 = vblendvps_avx(auVar124,auVar160,auVar165);
  auVar165 = vandps_avx(auVar161,local_2b0);
  auVar165 = vcmpps_avx(auVar165,auVar160,1);
  auVar165 = vblendvps_avx(auVar161,auVar160,auVar165);
  auVar16 = vrcpps_avx(auVar13);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = 0x3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar16,auVar189);
  auVar16 = vfmadd132ps_fma(auVar13,auVar16,auVar16);
  auVar13 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar13,auVar189);
  auVar17 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar165);
  auVar165 = vfnmadd213ps_fma(auVar165,auVar13,auVar189);
  auVar106 = vfmadd132ps_fma(auVar165,auVar13,auVar13);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar165 = vpmovsxwd_avx(auVar165);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar168);
  auVar161._0_4_ = auVar16._0_4_ * auVar165._0_4_;
  auVar161._4_4_ = auVar16._4_4_ * auVar165._4_4_;
  auVar161._8_4_ = auVar16._8_4_ * auVar165._8_4_;
  auVar161._12_4_ = auVar16._12_4_ * auVar165._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar100 * 9 + 6);
  auVar165 = vpmovsxwd_avx(auVar13);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar168);
  auVar180._0_4_ = auVar16._0_4_ * auVar165._0_4_;
  auVar180._4_4_ = auVar16._4_4_ * auVar165._4_4_;
  auVar180._8_4_ = auVar16._8_4_ * auVar165._8_4_;
  auVar180._12_4_ = auVar16._12_4_ * auVar165._12_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar100 * -2 + 6);
  auVar165 = vpmovsxwd_avx(auVar16);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar105);
  auVar194._0_4_ = auVar165._0_4_ * auVar17._0_4_;
  auVar194._4_4_ = auVar165._4_4_ * auVar17._4_4_;
  auVar194._8_4_ = auVar165._8_4_ * auVar17._8_4_;
  auVar194._12_4_ = auVar165._12_4_ * auVar17._12_4_;
  auVar165 = vcvtdq2ps_avx(auVar13);
  auVar165 = vsubps_avx(auVar165,auVar105);
  auVar123._0_4_ = auVar17._0_4_ * auVar165._0_4_;
  auVar123._4_4_ = auVar17._4_4_ * auVar165._4_4_;
  auVar123._8_4_ = auVar17._8_4_ * auVar165._8_4_;
  auVar123._12_4_ = auVar17._12_4_ * auVar165._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar94 + uVar100 + 6);
  auVar165 = vpmovsxwd_avx(auVar17);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar142);
  auVar155._0_4_ = auVar106._0_4_ * auVar165._0_4_;
  auVar155._4_4_ = auVar106._4_4_ * auVar165._4_4_;
  auVar155._8_4_ = auVar106._8_4_ * auVar165._8_4_;
  auVar155._12_4_ = auVar106._12_4_ * auVar165._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar100 * 0x17 + 6);
  auVar165 = vpmovsxwd_avx(auVar168);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar142);
  auVar105._0_4_ = auVar106._0_4_ * auVar165._0_4_;
  auVar105._4_4_ = auVar106._4_4_ * auVar165._4_4_;
  auVar105._8_4_ = auVar106._8_4_ * auVar165._8_4_;
  auVar105._12_4_ = auVar106._12_4_ * auVar165._12_4_;
  auVar165 = vpminsd_avx(auVar161,auVar180);
  auVar13 = vpminsd_avx(auVar194,auVar123);
  auVar165 = vmaxps_avx(auVar165,auVar13);
  auVar13 = vpminsd_avx(auVar155,auVar105);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar198._4_4_ = uVar4;
  auVar198._0_4_ = uVar4;
  auVar198._8_4_ = uVar4;
  auVar198._12_4_ = uVar4;
  auVar13 = vmaxps_avx(auVar13,auVar198);
  auVar165 = vmaxps_avx(auVar165,auVar13);
  local_2c0._0_4_ = auVar165._0_4_ * 0.99999964;
  local_2c0._4_4_ = auVar165._4_4_ * 0.99999964;
  local_2c0._8_4_ = auVar165._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar165._12_4_ * 0.99999964;
  auVar165 = vpmaxsd_avx(auVar161,auVar180);
  auVar13 = vpmaxsd_avx(auVar194,auVar123);
  auVar165 = vminps_avx(auVar165,auVar13);
  auVar13 = vpmaxsd_avx(auVar155,auVar105);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar142._4_4_ = uVar4;
  auVar142._0_4_ = uVar4;
  auVar142._8_4_ = uVar4;
  auVar142._12_4_ = uVar4;
  auVar13 = vminps_avx(auVar13,auVar142);
  auVar165 = vminps_avx(auVar165,auVar13);
  auVar106._0_4_ = auVar165._0_4_ * 1.0000004;
  auVar106._4_4_ = auVar165._4_4_ * 1.0000004;
  auVar106._8_4_ = auVar165._8_4_ * 1.0000004;
  auVar106._12_4_ = auVar165._12_4_ * 1.0000004;
  auVar124[4] = PVar8;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar8;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar8;
  auVar124._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar124,_DAT_01f7fcf0);
  auVar165 = vcmpps_avx(local_2c0,auVar106,2);
  auVar165 = vandps_avx(auVar165,auVar13);
  uVar95 = vmovmskps_avx(auVar165);
  if (uVar95 != 0) {
    uVar95 = uVar95 & 0xff;
    pLVar97 = pre->ray_space + k;
    local_5a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_5a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_6a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    pPVar98 = prim;
    local_778 = pLVar97;
    local_770 = pre;
    local_768 = prim;
    do {
      lVar23 = 0;
      uVar100 = (ulong)uVar95;
      for (uVar94 = uVar100; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar100 = uVar100 - 1 & uVar100;
      uVar4 = *(undefined4 *)(pPVar98 + lVar23 * 4 + 6);
      uVar94 = (ulong)(uint)((int)lVar23 << 6);
      local_7e0._4_4_ = *(undefined4 *)(pPVar98 + 2);
      pGVar10 = (context->scene->geometries).items[(uint)local_7e0._4_4_].ptr;
      pPVar1 = prim + uVar94 + lVar78 + 0x16;
      uVar89 = *(undefined8 *)pPVar1;
      uVar90 = *(undefined8 *)(pPVar1 + 8);
      auVar15 = *(undefined1 (*) [16])pPVar1;
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar165 = *(undefined1 (*) [16])pPVar1;
      if (uVar100 != 0) {
        uVar96 = uVar100 - 1 & uVar100;
        for (uVar24 = uVar100; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        }
        if (uVar96 != 0) {
          for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar16 = *(undefined1 (*) [16])(prim + uVar94 + lVar78 + 0x26);
      auVar17 = *(undefined1 (*) [16])(prim + uVar94 + lVar78 + 0x36);
      auVar168 = *(undefined1 (*) [16])(prim + uVar94 + lVar78 + 0x46);
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar123 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar105 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar123);
      uVar101 = auVar105._0_4_;
      auVar162._4_4_ = uVar101;
      auVar162._0_4_ = uVar101;
      auVar162._8_4_ = uVar101;
      auVar162._12_4_ = uVar101;
      auVar106 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      aVar5 = (pLVar97->vx).field_0;
      aVar6 = (pLVar97->vy).field_0;
      fVar206 = (pLVar97->vz).field_0.m128[0];
      fVar117 = *(float *)((long)&(pLVar97->vz).field_0 + 4);
      fVar118 = *(float *)((long)&(pLVar97->vz).field_0 + 8);
      fVar119 = *(float *)((long)&(pLVar97->vz).field_0 + 0xc);
      auVar186._0_4_ = fVar206 * auVar105._0_4_;
      auVar186._4_4_ = fVar117 * auVar105._4_4_;
      auVar186._8_4_ = fVar118 * auVar105._8_4_;
      auVar186._12_4_ = fVar119 * auVar105._12_4_;
      auVar106 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar106);
      auVar124 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar162);
      auVar106 = vblendps_avx(auVar124,*(undefined1 (*) [16])pPVar1,8);
      auVar142 = vsubps_avx(auVar16,auVar123);
      uVar101 = auVar142._0_4_;
      auVar187._4_4_ = uVar101;
      auVar187._0_4_ = uVar101;
      auVar187._8_4_ = uVar101;
      auVar187._12_4_ = uVar101;
      auVar105 = vshufps_avx(auVar142,auVar142,0x55);
      auVar142 = vshufps_avx(auVar142,auVar142,0xaa);
      auVar199._0_4_ = fVar206 * auVar142._0_4_;
      auVar199._4_4_ = fVar117 * auVar142._4_4_;
      auVar199._8_4_ = fVar118 * auVar142._8_4_;
      auVar199._12_4_ = fVar119 * auVar142._12_4_;
      auVar105 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar6,auVar105);
      auVar155 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar187);
      auVar105 = vblendps_avx(auVar155,auVar16,8);
      auVar104 = vsubps_avx(auVar17,auVar123);
      uVar101 = auVar104._0_4_;
      auVar190._4_4_ = uVar101;
      auVar190._0_4_ = uVar101;
      auVar190._8_4_ = uVar101;
      auVar190._12_4_ = uVar101;
      auVar142 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar208._0_4_ = fVar206 * auVar104._0_4_;
      auVar208._4_4_ = fVar117 * auVar104._4_4_;
      auVar208._8_4_ = fVar118 * auVar104._8_4_;
      auVar208._12_4_ = fVar119 * auVar104._12_4_;
      auVar142 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar142);
      auVar161 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar5,auVar190);
      auVar142 = vblendps_avx(auVar161,auVar17,8);
      auVar104 = vsubps_avx(auVar168,auVar123);
      uVar101 = auVar104._0_4_;
      auVar191._4_4_ = uVar101;
      auVar191._0_4_ = uVar101;
      auVar191._8_4_ = uVar101;
      auVar191._12_4_ = uVar101;
      auVar123 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar218._0_4_ = fVar206 * auVar104._0_4_;
      auVar218._4_4_ = fVar117 * auVar104._4_4_;
      auVar218._8_4_ = fVar118 * auVar104._8_4_;
      auVar218._12_4_ = fVar119 * auVar104._12_4_;
      auVar123 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar6,auVar123);
      auVar103 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar5,auVar191);
      auVar123 = vblendps_avx(auVar103,auVar168,8);
      auVar106 = vandps_avx(auVar106,local_2b0);
      auVar105 = vandps_avx(auVar105,local_2b0);
      auVar104 = vmaxps_avx(auVar106,auVar105);
      auVar106 = vandps_avx(auVar142,local_2b0);
      auVar105 = vandps_avx(auVar123,local_2b0);
      auVar106 = vmaxps_avx(auVar106,auVar105);
      auVar106 = vmaxps_avx(auVar104,auVar106);
      auVar105 = vmovshdup_avx(auVar106);
      auVar105 = vmaxss_avx(auVar105,auVar106);
      auVar106 = vshufpd_avx(auVar106,auVar106,1);
      auVar106 = vmaxss_avx(auVar106,auVar105);
      lVar23 = (long)iVar9 * 0x44;
      auVar105 = vmovshdup_avx(auVar124);
      uVar102 = auVar105._0_8_;
      local_480._8_8_ = uVar102;
      local_480._0_8_ = uVar102;
      local_480._16_8_ = uVar102;
      local_480._24_8_ = uVar102;
      auVar105 = vmovshdup_avx(auVar155);
      uVar102 = auVar105._0_8_;
      local_4a0._8_8_ = uVar102;
      local_4a0._0_8_ = uVar102;
      local_4a0._16_8_ = uVar102;
      local_4a0._24_8_ = uVar102;
      auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      uVar205 = auVar161._0_4_;
      local_660._4_4_ = uVar205;
      local_660._0_4_ = uVar205;
      local_660._8_4_ = uVar205;
      local_660._12_4_ = uVar205;
      local_660._16_4_ = uVar205;
      local_660._20_4_ = uVar205;
      local_660._24_4_ = uVar205;
      local_660._28_4_ = uVar205;
      auVar105 = vmovshdup_avx(auVar161);
      uVar102 = auVar105._0_8_;
      local_5c0._8_8_ = uVar102;
      local_5c0._0_8_ = uVar102;
      local_5c0._16_8_ = uVar102;
      local_5c0._24_8_ = uVar102;
      fVar206 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar23 + 0xd8c);
      auVar92 = *(undefined1 (*) [28])(bspline_basis0 + lVar23 + 0xd8c);
      local_460 = auVar103._0_4_;
      auVar105 = vmovshdup_avx(auVar103);
      local_140 = auVar105._0_8_;
      auVar173._4_4_ = local_460 * *(float *)(bspline_basis0 + lVar23 + 0xd90);
      auVar173._0_4_ = local_460 * fVar206;
      auVar173._8_4_ = local_460 * *(float *)(bspline_basis0 + lVar23 + 0xd94);
      auVar173._12_4_ = local_460 * *(float *)(bspline_basis0 + lVar23 + 0xd98);
      auVar173._16_4_ = local_460 * *(float *)(bspline_basis0 + lVar23 + 0xd9c);
      auVar173._20_4_ = local_460 * *(float *)(bspline_basis0 + lVar23 + 0xda0);
      auVar173._24_4_ = local_460 * *(float *)(bspline_basis0 + lVar23 + 0xda4);
      auVar173._28_4_ = *(undefined4 *)(bspline_basis0 + lVar23 + 0xda8);
      auVar142 = vfmadd231ps_fma(auVar173,auVar135,local_660);
      fVar177 = auVar105._0_4_;
      auVar221._0_4_ = fVar177 * fVar206;
      fVar185 = auVar105._4_4_;
      auVar221._4_4_ = fVar185 * *(float *)(bspline_basis0 + lVar23 + 0xd90);
      auVar221._8_4_ = fVar177 * *(float *)(bspline_basis0 + lVar23 + 0xd94);
      auVar221._12_4_ = fVar185 * *(float *)(bspline_basis0 + lVar23 + 0xd98);
      auVar221._16_4_ = fVar177 * *(float *)(bspline_basis0 + lVar23 + 0xd9c);
      auVar221._20_4_ = fVar185 * *(float *)(bspline_basis0 + lVar23 + 0xda0);
      auVar221._24_4_ = fVar177 * *(float *)(bspline_basis0 + lVar23 + 0xda4);
      auVar221._28_4_ = 0;
      auVar105 = vfmadd231ps_fma(auVar221,auVar135,local_5c0);
      auVar173 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      uVar197 = auVar155._0_4_;
      local_740._4_4_ = uVar197;
      local_740._0_4_ = uVar197;
      local_740._8_4_ = uVar197;
      local_740._12_4_ = uVar197;
      local_740._16_4_ = uVar197;
      local_740._20_4_ = uVar197;
      local_740._24_4_ = uVar197;
      local_740._28_4_ = uVar197;
      auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar173,local_740);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar173,local_4a0);
      auVar221 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar101 = auVar124._0_4_;
      local_760._4_4_ = uVar101;
      local_760._0_4_ = uVar101;
      local_760._8_4_ = uVar101;
      local_760._12_4_ = uVar101;
      local_760._16_4_ = uVar101;
      local_760._20_4_ = uVar101;
      local_760._24_4_ = uVar101;
      local_760._28_4_ = uVar101;
      auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar221,local_760);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar221,local_480);
      auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      fVar214 = *(float *)(bspline_basis1 + lVar23 + 0xd8c);
      fVar215 = *(float *)(bspline_basis1 + lVar23 + 0xd90);
      fVar216 = *(float *)(bspline_basis1 + lVar23 + 0xd94);
      fVar217 = *(float *)(bspline_basis1 + lVar23 + 0xd98);
      fVar120 = *(float *)(bspline_basis1 + lVar23 + 0xd9c);
      fVar80 = *(float *)(bspline_basis1 + lVar23 + 0xda0);
      fVar81 = *(float *)(bspline_basis1 + lVar23 + 0xda4);
      auVar132._4_4_ = local_460 * fVar215;
      auVar132._0_4_ = local_460 * fVar214;
      auVar132._8_4_ = local_460 * fVar216;
      auVar132._12_4_ = local_460 * fVar217;
      auVar132._16_4_ = local_460 * fVar120;
      auVar132._20_4_ = local_460 * fVar80;
      auVar132._24_4_ = local_460 * fVar81;
      auVar132._28_4_ = *(undefined4 *)(bspline_basis0 + lVar23 + 0xda8);
      auVar123 = vfmadd231ps_fma(auVar132,auVar114,local_660);
      uStack_138 = local_140;
      uStack_130 = local_140;
      uStack_128 = local_140;
      auVar7._4_4_ = fVar215 * fVar185;
      auVar7._0_4_ = fVar214 * fVar177;
      auVar7._8_4_ = fVar216 * fVar177;
      auVar7._12_4_ = fVar217 * fVar185;
      auVar7._16_4_ = fVar120 * fVar177;
      auVar7._20_4_ = fVar80 * fVar185;
      auVar7._24_4_ = fVar81 * fVar177;
      auVar7._28_4_ = uVar205;
      auVar104 = vfmadd231ps_fma(auVar7,auVar114,local_5c0);
      auVar132 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar132,local_740);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar132,local_4a0);
      auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar7,local_760);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar7,local_480);
      local_300 = ZEXT1632(auVar123);
      auVar127 = ZEXT1632(auVar142);
      local_4c0 = vsubps_avx(local_300,auVar127);
      _local_500 = ZEXT1632(auVar104);
      local_320 = ZEXT1632(auVar105);
      local_340 = vsubps_avx(_local_500,local_320);
      auVar108._0_4_ = auVar105._0_4_ * local_4c0._0_4_;
      auVar108._4_4_ = auVar105._4_4_ * local_4c0._4_4_;
      auVar108._8_4_ = auVar105._8_4_ * local_4c0._8_4_;
      auVar108._12_4_ = auVar105._12_4_ * local_4c0._12_4_;
      auVar108._16_4_ = local_4c0._16_4_ * 0.0;
      auVar108._20_4_ = local_4c0._20_4_ * 0.0;
      auVar108._24_4_ = local_4c0._24_4_ * 0.0;
      auVar108._28_4_ = 0;
      fVar206 = local_340._0_4_;
      auVar128._0_4_ = auVar142._0_4_ * fVar206;
      fVar117 = local_340._4_4_;
      auVar128._4_4_ = auVar142._4_4_ * fVar117;
      fVar118 = local_340._8_4_;
      auVar128._8_4_ = auVar142._8_4_ * fVar118;
      fVar119 = local_340._12_4_;
      auVar128._12_4_ = auVar142._12_4_ * fVar119;
      fVar14 = local_340._16_4_;
      auVar128._16_4_ = fVar14 * 0.0;
      fVar212 = local_340._20_4_;
      auVar128._20_4_ = fVar212 * 0.0;
      fVar213 = local_340._24_4_;
      auVar128._24_4_ = fVar213 * 0.0;
      auVar128._28_4_ = 0;
      auVar108 = vsubps_avx(auVar108,auVar128);
      auVar105 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar102 = auVar105._0_8_;
      local_80._8_8_ = uVar102;
      local_80._0_8_ = uVar102;
      local_80._16_8_ = uVar102;
      local_80._24_8_ = uVar102;
      auVar142 = vpermilps_avx(auVar16,0xff);
      uVar102 = auVar142._0_8_;
      local_a0._8_8_ = uVar102;
      local_a0._0_8_ = uVar102;
      local_a0._16_8_ = uVar102;
      local_a0._24_8_ = uVar102;
      auVar142 = vpermilps_avx(auVar17,0xff);
      uVar102 = auVar142._0_8_;
      local_c0._8_8_ = uVar102;
      local_c0._0_8_ = uVar102;
      local_c0._16_8_ = uVar102;
      local_c0._24_8_ = uVar102;
      auVar142 = vpermilps_avx(auVar168,0xff);
      local_e0 = auVar142._0_8_;
      local_800 = auVar92._0_4_;
      fStack_7fc = auVar92._4_4_;
      fStack_7f8 = auVar92._8_4_;
      fStack_7f4 = auVar92._12_4_;
      fStack_7f0 = auVar92._16_4_;
      fStack_7ec = auVar92._20_4_;
      fStack_7e8 = auVar92._24_4_;
      fVar121 = auVar142._0_4_;
      fVar141 = auVar142._4_4_;
      auVar195._4_4_ = fVar141 * fStack_7fc;
      auVar195._0_4_ = fVar121 * local_800;
      auVar195._8_4_ = fVar121 * fStack_7f8;
      auVar195._12_4_ = fVar141 * fStack_7f4;
      auVar195._16_4_ = fVar121 * fStack_7f0;
      auVar195._20_4_ = fVar141 * fStack_7ec;
      auVar195._24_4_ = fVar121 * fStack_7e8;
      auVar195._28_4_ = uVar197;
      auVar142 = vfmadd231ps_fma(auVar195,local_c0,auVar135);
      auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar173,local_a0);
      auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar221,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar21._4_4_ = fVar215 * fVar141;
      auVar21._0_4_ = fVar214 * fVar121;
      auVar21._8_4_ = fVar216 * fVar121;
      auVar21._12_4_ = fVar217 * fVar141;
      auVar21._16_4_ = fVar120 * fVar121;
      auVar21._20_4_ = fVar80 * fVar141;
      auVar21._24_4_ = fVar81 * fVar121;
      auVar21._28_4_ = fVar141;
      auVar123 = vfmadd231ps_fma(auVar21,auVar114,local_c0);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar132,local_a0);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar7,local_80);
      auVar153._4_4_ = fVar117 * fVar117;
      auVar153._0_4_ = fVar206 * fVar206;
      auVar153._8_4_ = fVar118 * fVar118;
      auVar153._12_4_ = fVar119 * fVar119;
      auVar153._16_4_ = fVar14 * fVar14;
      auVar153._20_4_ = fVar212 * fVar212;
      auVar153._24_4_ = fVar213 * fVar213;
      auVar153._28_4_ = auVar105._4_4_;
      auVar105 = vfmadd231ps_fma(auVar153,local_4c0,local_4c0);
      auVar153 = ZEXT1632(auVar123);
      auVar195 = vmaxps_avx(ZEXT1632(auVar142),auVar153);
      auVar22._4_4_ = auVar195._4_4_ * auVar195._4_4_ * auVar105._4_4_;
      auVar22._0_4_ = auVar195._0_4_ * auVar195._0_4_ * auVar105._0_4_;
      auVar22._8_4_ = auVar195._8_4_ * auVar195._8_4_ * auVar105._8_4_;
      auVar22._12_4_ = auVar195._12_4_ * auVar195._12_4_ * auVar105._12_4_;
      auVar22._16_4_ = auVar195._16_4_ * auVar195._16_4_ * 0.0;
      auVar22._20_4_ = auVar195._20_4_ * auVar195._20_4_ * 0.0;
      auVar22._24_4_ = auVar195._24_4_ * auVar195._24_4_ * 0.0;
      auVar22._28_4_ = auVar195._28_4_;
      auVar20._4_4_ = auVar108._4_4_ * auVar108._4_4_;
      auVar20._0_4_ = auVar108._0_4_ * auVar108._0_4_;
      auVar20._8_4_ = auVar108._8_4_ * auVar108._8_4_;
      auVar20._12_4_ = auVar108._12_4_ * auVar108._12_4_;
      auVar20._16_4_ = auVar108._16_4_ * auVar108._16_4_;
      auVar20._20_4_ = auVar108._20_4_ * auVar108._20_4_;
      auVar20._24_4_ = auVar108._24_4_ * auVar108._24_4_;
      auVar20._28_4_ = 0;
      auVar195 = vcmpps_avx(auVar20,auVar22,2);
      fVar206 = auVar106._0_4_ * 4.7683716e-07;
      auVar109._0_4_ = (float)iVar9;
      register0x00001504 = auVar103._4_12_;
      auVar109._4_4_ = auVar109._0_4_;
      auVar109._8_4_ = auVar109._0_4_;
      auVar109._12_4_ = auVar109._0_4_;
      auVar109._16_4_ = auVar109._0_4_;
      auVar109._20_4_ = auVar109._0_4_;
      auVar109._24_4_ = auVar109._0_4_;
      auVar109._28_4_ = auVar109._0_4_;
      auVar108 = vcmpps_avx(_DAT_01faff40,auVar109,1);
      auVar106 = vpermilps_avx(auVar124,0xaa);
      uVar102 = auVar106._0_8_;
      auVar156._8_8_ = uVar102;
      auVar156._0_8_ = uVar102;
      auVar156._16_8_ = uVar102;
      auVar156._24_8_ = uVar102;
      auVar106 = vpermilps_avx(auVar155,0xaa);
      uVar102 = auVar106._0_8_;
      local_680._8_8_ = uVar102;
      local_680._0_8_ = uVar102;
      local_680._16_8_ = uVar102;
      local_680._24_8_ = uVar102;
      auVar105 = vpermilps_avx(auVar161,0xaa);
      uVar102 = auVar105._0_8_;
      auVar204._8_8_ = uVar102;
      auVar204._0_8_ = uVar102;
      auVar204._16_8_ = uVar102;
      auVar204._24_8_ = uVar102;
      auVar106 = vshufps_avx(auVar103,auVar103,0xaa);
      uVar102 = auVar106._0_8_;
      register0x00001508 = uVar102;
      local_620 = uVar102;
      register0x00001510 = uVar102;
      register0x00001518 = uVar102;
      auVar220 = ZEXT3264(_local_620);
      auVar21 = auVar108 & auVar195;
      uVar95 = *(uint *)(ray + k * 4 + 0x30);
      local_600._0_16_ = ZEXT416(uVar95);
      local_7a0 = auVar16._0_8_;
      uStack_798 = auVar16._8_8_;
      local_7b0 = auVar17._0_8_;
      uStack_7a8 = auVar17._8_8_;
      local_7c0._0_4_ = auVar168._0_4_;
      fVar117 = (float)local_7c0;
      local_7c0._4_4_ = auVar168._4_4_;
      fVar118 = local_7c0._4_4_;
      uStack_7b8._0_4_ = auVar168._8_4_;
      fVar119 = (float)uStack_7b8;
      uStack_7b8._4_4_ = auVar168._12_4_;
      fVar14 = uStack_7b8._4_4_;
      local_7c0 = auVar168._0_8_;
      uStack_7b8 = auVar168._8_8_;
      fStack_45c = local_460;
      fStack_458 = local_460;
      fStack_454 = local_460;
      fStack_450 = local_460;
      fStack_44c = local_460;
      fStack_448 = local_460;
      fStack_444 = local_460;
      local_630._0_4_ = auVar109._0_4_;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        auVar210 = ZEXT3264(local_680);
        auVar140 = ZEXT3264(local_660);
        auVar159 = ZEXT3264(local_5c0);
        auVar192 = ZEXT3264(local_740);
        auVar226 = ZEXT3264(local_760);
      }
      else {
        local_560 = SUB84(pGVar10,0);
        uStack_55c = (undefined4)((ulong)pGVar10 >> 0x20);
        _local_360 = vandps_avx(auVar195,auVar108);
        fVar121 = auVar106._0_4_;
        fVar141 = auVar106._4_4_;
        auVar18._4_4_ = fVar141 * fVar215;
        auVar18._0_4_ = fVar121 * fVar214;
        auVar18._8_4_ = fVar121 * fVar216;
        auVar18._12_4_ = fVar141 * fVar217;
        auVar18._16_4_ = fVar121 * fVar120;
        auVar18._20_4_ = fVar141 * fVar80;
        auVar18._24_4_ = fVar121 * fVar81;
        auVar18._28_4_ = local_360._28_4_;
        auVar168 = vfmadd213ps_fma(auVar114,auVar204,auVar18);
        auVar168 = vfmadd213ps_fma(auVar132,local_680,ZEXT1632(auVar168));
        auVar168 = vfmadd213ps_fma(auVar7,auVar156,ZEXT1632(auVar168));
        auVar110._0_4_ = fVar121 * local_800;
        auVar110._4_4_ = fVar141 * fStack_7fc;
        auVar110._8_4_ = fVar121 * fStack_7f8;
        auVar110._12_4_ = fVar141 * fStack_7f4;
        auVar110._16_4_ = fVar121 * fStack_7f0;
        auVar110._20_4_ = fVar141 * fStack_7ec;
        auVar110._24_4_ = fVar121 * fStack_7e8;
        auVar110._28_4_ = 0;
        auVar106 = vfmadd213ps_fma(auVar135,auVar204,auVar110);
        auVar106 = vfmadd213ps_fma(auVar173,local_680,ZEXT1632(auVar106));
        auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        fVar212 = *(float *)(bspline_basis0 + lVar23 + 0x1f9c);
        fVar213 = *(float *)(bspline_basis0 + lVar23 + 0x1fa0);
        fVar214 = *(float *)(bspline_basis0 + lVar23 + 0x1fa4);
        fVar215 = *(float *)(bspline_basis0 + lVar23 + 0x1fa8);
        fVar216 = *(float *)(bspline_basis0 + lVar23 + 0x1fac);
        fVar217 = *(float *)(bspline_basis0 + lVar23 + 0x1fb0);
        fVar120 = *(float *)(bspline_basis0 + lVar23 + 0x1fb4);
        auVar181._0_4_ = local_460 * fVar212;
        auVar181._4_4_ = local_460 * fVar213;
        auVar181._8_4_ = local_460 * fVar214;
        auVar181._12_4_ = local_460 * fVar215;
        auVar181._16_4_ = local_460 * fVar216;
        auVar181._20_4_ = local_460 * fVar217;
        auVar181._24_4_ = local_460 * fVar120;
        auVar181._28_4_ = 0;
        auVar19._4_4_ = fVar185 * fVar213;
        auVar19._0_4_ = fVar177 * fVar212;
        auVar19._8_4_ = fVar177 * fVar214;
        auVar19._12_4_ = fVar185 * fVar215;
        auVar19._16_4_ = fVar177 * fVar216;
        auVar19._20_4_ = fVar185 * fVar217;
        auVar19._24_4_ = fVar177 * fVar120;
        auVar19._28_4_ = auVar173._28_4_;
        auVar174._4_4_ = fVar213 * fVar141;
        auVar174._0_4_ = fVar212 * fVar121;
        auVar174._8_4_ = fVar214 * fVar121;
        auVar174._12_4_ = fVar215 * fVar141;
        auVar174._16_4_ = fVar216 * fVar121;
        auVar174._20_4_ = fVar217 * fVar141;
        auVar174._24_4_ = fVar120 * fVar121;
        auVar174._28_4_ = auVar105._4_4_;
        auVar105 = vfmadd231ps_fma(auVar181,auVar132,local_660);
        auVar123 = vfmadd231ps_fma(auVar19,auVar132,local_5c0);
        auVar104 = vfmadd231ps_fma(auVar174,auVar204,auVar132);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar114,local_740);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar114,local_4a0);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_680,auVar114);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar135,local_760);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar135,local_480);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar135,auVar156);
        fVar212 = *(float *)(bspline_basis1 + lVar23 + 0x1f9c);
        fVar213 = *(float *)(bspline_basis1 + lVar23 + 0x1fa0);
        fVar214 = *(float *)(bspline_basis1 + lVar23 + 0x1fa4);
        fVar215 = *(float *)(bspline_basis1 + lVar23 + 0x1fa8);
        fVar216 = *(float *)(bspline_basis1 + lVar23 + 0x1fac);
        fVar217 = *(float *)(bspline_basis1 + lVar23 + 0x1fb0);
        fVar120 = *(float *)(bspline_basis1 + lVar23 + 0x1fb4);
        auVar114._4_4_ = local_460 * fVar213;
        auVar114._0_4_ = local_460 * fVar212;
        auVar114._8_4_ = local_460 * fVar214;
        auVar114._12_4_ = local_460 * fVar215;
        auVar114._16_4_ = local_460 * fVar216;
        auVar114._20_4_ = local_460 * fVar217;
        auVar114._24_4_ = local_460 * fVar120;
        auVar114._28_4_ = local_460;
        auVar25._4_4_ = fVar185 * fVar213;
        auVar25._0_4_ = fVar177 * fVar212;
        auVar25._8_4_ = fVar177 * fVar214;
        auVar25._12_4_ = fVar185 * fVar215;
        auVar25._16_4_ = fVar177 * fVar216;
        auVar25._20_4_ = fVar185 * fVar217;
        auVar25._24_4_ = fVar177 * fVar120;
        auVar25._28_4_ = fVar185;
        auVar26._4_4_ = fVar141 * fVar213;
        auVar26._0_4_ = fVar121 * fVar212;
        auVar26._8_4_ = fVar121 * fVar214;
        auVar26._12_4_ = fVar141 * fVar215;
        auVar26._16_4_ = fVar121 * fVar216;
        auVar26._20_4_ = fVar141 * fVar217;
        auVar26._24_4_ = fVar121 * fVar120;
        auVar26._28_4_ = fVar141;
        auVar135 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar124 = vfmadd231ps_fma(auVar114,auVar135,local_660);
        auVar155 = vfmadd231ps_fma(auVar25,auVar135,local_5c0);
        auVar161 = vfmadd231ps_fma(auVar26,auVar204,auVar135);
        auVar135 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar135,local_740);
        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar135,local_4a0);
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),local_680,auVar135);
        auVar135 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar135,local_760);
        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar135,local_480);
        auVar129._8_4_ = 0x7fffffff;
        auVar129._0_8_ = 0x7fffffff7fffffff;
        auVar129._12_4_ = 0x7fffffff;
        auVar129._16_4_ = 0x7fffffff;
        auVar129._20_4_ = 0x7fffffff;
        auVar129._24_4_ = 0x7fffffff;
        auVar129._28_4_ = 0x7fffffff;
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar156,auVar135);
        auVar135 = vandps_avx(ZEXT1632(auVar105),auVar129);
        auVar173 = vandps_avx(ZEXT1632(auVar123),auVar129);
        auVar173 = vmaxps_avx(auVar135,auVar173);
        auVar135 = vandps_avx(ZEXT1632(auVar104),auVar129);
        auVar135 = vmaxps_avx(auVar173,auVar135);
        auVar151._4_4_ = fVar206;
        auVar151._0_4_ = fVar206;
        auVar151._8_4_ = fVar206;
        auVar151._12_4_ = fVar206;
        auVar151._16_4_ = fVar206;
        auVar151._20_4_ = fVar206;
        auVar151._24_4_ = fVar206;
        auVar151._28_4_ = fVar206;
        auVar135 = vcmpps_avx(auVar135,auVar151,1);
        auVar114 = vblendvps_avx(ZEXT1632(auVar105),local_4c0,auVar135);
        auVar132 = vblendvps_avx(ZEXT1632(auVar123),local_340,auVar135);
        auVar135 = vandps_avx(ZEXT1632(auVar124),auVar129);
        auVar173 = vandps_avx(ZEXT1632(auVar155),auVar129);
        auVar7 = vmaxps_avx(auVar135,auVar173);
        auVar135 = vandps_avx(ZEXT1632(auVar161),auVar129);
        auVar135 = vmaxps_avx(auVar7,auVar135);
        auVar195 = vcmpps_avx(auVar135,auVar151,1);
        auVar135 = vblendvps_avx(ZEXT1632(auVar124),local_4c0,auVar195);
        auVar7 = vblendvps_avx(ZEXT1632(auVar155),local_340,auVar195);
        auVar106 = vfmadd213ps_fma(auVar221,auVar156,ZEXT1632(auVar106));
        auVar105 = vfmadd213ps_fma(auVar114,auVar114,ZEXT832(0) << 0x20);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar132,auVar132);
        auVar221 = vrsqrtps_avx(ZEXT1632(auVar105));
        fVar212 = auVar221._0_4_;
        fVar213 = auVar221._4_4_;
        fVar214 = auVar221._8_4_;
        fVar215 = auVar221._12_4_;
        fVar216 = auVar221._16_4_;
        fVar217 = auVar221._20_4_;
        fVar120 = auVar221._24_4_;
        auVar27._4_4_ = fVar213 * fVar213 * fVar213 * auVar105._4_4_ * -0.5;
        auVar27._0_4_ = fVar212 * fVar212 * fVar212 * auVar105._0_4_ * -0.5;
        auVar27._8_4_ = fVar214 * fVar214 * fVar214 * auVar105._8_4_ * -0.5;
        auVar27._12_4_ = fVar215 * fVar215 * fVar215 * auVar105._12_4_ * -0.5;
        auVar27._16_4_ = fVar216 * fVar216 * fVar216 * -0.0;
        auVar27._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
        auVar27._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar27._28_4_ = 0;
        auVar224._8_4_ = 0x3fc00000;
        auVar224._0_8_ = 0x3fc000003fc00000;
        auVar224._12_4_ = 0x3fc00000;
        auVar224._16_4_ = 0x3fc00000;
        auVar224._20_4_ = 0x3fc00000;
        auVar224._24_4_ = 0x3fc00000;
        auVar224._28_4_ = 0x3fc00000;
        auVar105 = vfmadd231ps_fma(auVar27,auVar224,auVar221);
        fVar212 = auVar105._0_4_;
        fVar213 = auVar105._4_4_;
        auVar28._4_4_ = auVar132._4_4_ * fVar213;
        auVar28._0_4_ = auVar132._0_4_ * fVar212;
        fVar214 = auVar105._8_4_;
        auVar28._8_4_ = auVar132._8_4_ * fVar214;
        fVar215 = auVar105._12_4_;
        auVar28._12_4_ = auVar132._12_4_ * fVar215;
        auVar28._16_4_ = auVar132._16_4_ * 0.0;
        auVar28._20_4_ = auVar132._20_4_ * 0.0;
        auVar28._24_4_ = auVar132._24_4_ * 0.0;
        auVar28._28_4_ = auVar221._28_4_;
        auVar29._4_4_ = fVar213 * -auVar114._4_4_;
        auVar29._0_4_ = fVar212 * -auVar114._0_4_;
        auVar29._8_4_ = fVar214 * -auVar114._8_4_;
        auVar29._12_4_ = fVar215 * -auVar114._12_4_;
        auVar29._16_4_ = -auVar114._16_4_ * 0.0;
        auVar29._20_4_ = -auVar114._20_4_ * 0.0;
        auVar29._24_4_ = -auVar114._24_4_ * 0.0;
        auVar29._28_4_ = auVar173._28_4_;
        auVar105 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,auVar7);
        auVar173 = vrsqrtps_avx(ZEXT1632(auVar105));
        auVar30._28_4_ = auVar195._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar215 * 0.0,
                                CONCAT48(fVar214 * 0.0,CONCAT44(fVar213 * 0.0,fVar212 * 0.0))));
        fVar212 = auVar173._0_4_;
        fVar213 = auVar173._4_4_;
        fVar214 = auVar173._8_4_;
        fVar215 = auVar173._12_4_;
        fVar216 = auVar173._16_4_;
        fVar217 = auVar173._20_4_;
        fVar120 = auVar173._24_4_;
        auVar31._4_4_ = fVar213 * fVar213 * fVar213 * auVar105._4_4_ * -0.5;
        auVar31._0_4_ = fVar212 * fVar212 * fVar212 * auVar105._0_4_ * -0.5;
        auVar31._8_4_ = fVar214 * fVar214 * fVar214 * auVar105._8_4_ * -0.5;
        auVar31._12_4_ = fVar215 * fVar215 * fVar215 * auVar105._12_4_ * -0.5;
        auVar31._16_4_ = fVar216 * fVar216 * fVar216 * -0.0;
        auVar31._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
        auVar31._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar31._28_4_ = 0;
        auVar105 = vfmadd231ps_fma(auVar31,auVar224,auVar173);
        fVar212 = auVar105._0_4_;
        fVar213 = auVar105._4_4_;
        auVar32._4_4_ = auVar7._4_4_ * fVar213;
        auVar32._0_4_ = auVar7._0_4_ * fVar212;
        fVar214 = auVar105._8_4_;
        auVar32._8_4_ = auVar7._8_4_ * fVar214;
        fVar215 = auVar105._12_4_;
        auVar32._12_4_ = auVar7._12_4_ * fVar215;
        auVar32._16_4_ = auVar7._16_4_ * 0.0;
        auVar32._20_4_ = auVar7._20_4_ * 0.0;
        auVar32._24_4_ = auVar7._24_4_ * 0.0;
        auVar32._28_4_ = 0;
        auVar33._4_4_ = -auVar135._4_4_ * fVar213;
        auVar33._0_4_ = -auVar135._0_4_ * fVar212;
        auVar33._8_4_ = -auVar135._8_4_ * fVar214;
        auVar33._12_4_ = -auVar135._12_4_ * fVar215;
        auVar33._16_4_ = -auVar135._16_4_ * 0.0;
        auVar33._20_4_ = -auVar135._20_4_ * 0.0;
        auVar33._24_4_ = -auVar135._24_4_ * 0.0;
        auVar33._28_4_ = auVar7._28_4_;
        auVar135._28_4_ = auVar173._28_4_;
        auVar135._0_28_ =
             ZEXT1628(CONCAT412(fVar215 * 0.0,
                                CONCAT48(fVar214 * 0.0,CONCAT44(fVar213 * 0.0,fVar212 * 0.0))));
        auVar105 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar142),auVar127);
        auVar173 = ZEXT1632(auVar142);
        auVar123 = vfmadd213ps_fma(auVar29,auVar173,local_320);
        auVar104 = vfmadd213ps_fma(auVar30,auVar173,ZEXT1632(auVar106));
        auVar161 = vfnmadd213ps_fma(auVar28,auVar173,auVar127);
        auVar124 = vfmadd213ps_fma(auVar32,auVar153,local_300);
        auVar103 = vfnmadd213ps_fma(auVar29,auVar173,local_320);
        auVar155 = vfmadd213ps_fma(auVar33,auVar153,_local_500);
        auVar174 = ZEXT1632(auVar142);
        auVar178 = vfnmadd231ps_fma(ZEXT1632(auVar106),auVar174,auVar30);
        auVar106 = vfmadd213ps_fma(auVar135,auVar153,ZEXT1632(auVar168));
        auVar122 = vfnmadd213ps_fma(auVar32,auVar153,local_300);
        auVar160 = vfnmadd213ps_fma(auVar33,auVar153,_local_500);
        auVar179 = vfnmadd231ps_fma(ZEXT1632(auVar168),auVar153,auVar135);
        auVar135 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar103));
        auVar173 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar178));
        auVar127._4_4_ = auVar178._4_4_ * auVar135._4_4_;
        auVar127._0_4_ = auVar178._0_4_ * auVar135._0_4_;
        auVar127._8_4_ = auVar178._8_4_ * auVar135._8_4_;
        auVar127._12_4_ = auVar178._12_4_ * auVar135._12_4_;
        auVar127._16_4_ = auVar135._16_4_ * 0.0;
        auVar127._20_4_ = auVar135._20_4_ * 0.0;
        auVar127._24_4_ = auVar135._24_4_ * 0.0;
        auVar127._28_4_ = 0;
        auVar142 = vfmsub231ps_fma(auVar127,ZEXT1632(auVar103),auVar173);
        auVar34._4_4_ = auVar161._4_4_ * auVar173._4_4_;
        auVar34._0_4_ = auVar161._0_4_ * auVar173._0_4_;
        auVar34._8_4_ = auVar161._8_4_ * auVar173._8_4_;
        auVar34._12_4_ = auVar161._12_4_ * auVar173._12_4_;
        auVar34._16_4_ = auVar173._16_4_ * 0.0;
        auVar34._20_4_ = auVar173._20_4_ * 0.0;
        auVar34._24_4_ = auVar173._24_4_ * 0.0;
        auVar34._28_4_ = auVar173._28_4_;
        auVar195 = ZEXT1632(auVar161);
        auVar173 = vsubps_avx(ZEXT1632(auVar124),auVar195);
        auVar168 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar178),auVar173);
        auVar35._4_4_ = auVar103._4_4_ * auVar173._4_4_;
        auVar35._0_4_ = auVar103._0_4_ * auVar173._0_4_;
        auVar35._8_4_ = auVar103._8_4_ * auVar173._8_4_;
        auVar35._12_4_ = auVar103._12_4_ * auVar173._12_4_;
        auVar35._16_4_ = auVar173._16_4_ * 0.0;
        auVar35._20_4_ = auVar173._20_4_ * 0.0;
        auVar35._24_4_ = auVar173._24_4_ * 0.0;
        auVar35._28_4_ = auVar173._28_4_;
        auVar161 = vfmsub231ps_fma(auVar35,auVar195,auVar135);
        auVar135 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar135,ZEXT1632(auVar168));
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar135,ZEXT1632(auVar142));
        auVar22 = vcmpps_avx(ZEXT1632(auVar168),ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar135 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar105),auVar22);
        auVar173 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar123),auVar22);
        auVar221 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar104),auVar22);
        auVar114 = vblendvps_avx(auVar195,ZEXT1632(auVar124),auVar22);
        auVar132 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar155),auVar22);
        auVar7 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar106),auVar22);
        auVar195 = vblendvps_avx(ZEXT1632(auVar124),auVar195,auVar22);
        auVar108 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar103),auVar22);
        auVar168 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar21 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar178),auVar22);
        auVar20 = vsubps_avx(auVar195,auVar135);
        auVar108 = vsubps_avx(auVar108,auVar173);
        auVar127 = vsubps_avx(auVar21,auVar221);
        auVar128 = vsubps_avx(auVar135,auVar114);
        auVar18 = vsubps_avx(auVar173,auVar132);
        auVar19 = vsubps_avx(auVar221,auVar7);
        auVar36._4_4_ = auVar127._4_4_ * auVar135._4_4_;
        auVar36._0_4_ = auVar127._0_4_ * auVar135._0_4_;
        auVar36._8_4_ = auVar127._8_4_ * auVar135._8_4_;
        auVar36._12_4_ = auVar127._12_4_ * auVar135._12_4_;
        auVar36._16_4_ = auVar127._16_4_ * auVar135._16_4_;
        auVar36._20_4_ = auVar127._20_4_ * auVar135._20_4_;
        auVar36._24_4_ = auVar127._24_4_ * auVar135._24_4_;
        auVar36._28_4_ = auVar21._28_4_;
        auVar106 = vfmsub231ps_fma(auVar36,auVar221,auVar20);
        auVar37._4_4_ = auVar20._4_4_ * auVar173._4_4_;
        auVar37._0_4_ = auVar20._0_4_ * auVar173._0_4_;
        auVar37._8_4_ = auVar20._8_4_ * auVar173._8_4_;
        auVar37._12_4_ = auVar20._12_4_ * auVar173._12_4_;
        auVar37._16_4_ = auVar20._16_4_ * auVar173._16_4_;
        auVar37._20_4_ = auVar20._20_4_ * auVar173._20_4_;
        auVar37._24_4_ = auVar20._24_4_ * auVar173._24_4_;
        auVar37._28_4_ = auVar195._28_4_;
        auVar105 = vfmsub231ps_fma(auVar37,auVar135,auVar108);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
        auVar111._0_4_ = auVar108._0_4_ * auVar221._0_4_;
        auVar111._4_4_ = auVar108._4_4_ * auVar221._4_4_;
        auVar111._8_4_ = auVar108._8_4_ * auVar221._8_4_;
        auVar111._12_4_ = auVar108._12_4_ * auVar221._12_4_;
        auVar111._16_4_ = auVar108._16_4_ * auVar221._16_4_;
        auVar111._20_4_ = auVar108._20_4_ * auVar221._20_4_;
        auVar111._24_4_ = auVar108._24_4_ * auVar221._24_4_;
        auVar111._28_4_ = 0;
        auVar105 = vfmsub231ps_fma(auVar111,auVar173,auVar127);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
        auVar112._0_4_ = auVar19._0_4_ * auVar114._0_4_;
        auVar112._4_4_ = auVar19._4_4_ * auVar114._4_4_;
        auVar112._8_4_ = auVar19._8_4_ * auVar114._8_4_;
        auVar112._12_4_ = auVar19._12_4_ * auVar114._12_4_;
        auVar112._16_4_ = auVar19._16_4_ * auVar114._16_4_;
        auVar112._20_4_ = auVar19._20_4_ * auVar114._20_4_;
        auVar112._24_4_ = auVar19._24_4_ * auVar114._24_4_;
        auVar112._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar112,auVar128,auVar7);
        auVar38._4_4_ = auVar18._4_4_ * auVar7._4_4_;
        auVar38._0_4_ = auVar18._0_4_ * auVar7._0_4_;
        auVar38._8_4_ = auVar18._8_4_ * auVar7._8_4_;
        auVar38._12_4_ = auVar18._12_4_ * auVar7._12_4_;
        auVar38._16_4_ = auVar18._16_4_ * auVar7._16_4_;
        auVar38._20_4_ = auVar18._20_4_ * auVar7._20_4_;
        auVar38._24_4_ = auVar18._24_4_ * auVar7._24_4_;
        auVar38._28_4_ = auVar7._28_4_;
        auVar142 = vfmsub231ps_fma(auVar38,auVar132,auVar19);
        auVar39._4_4_ = auVar128._4_4_ * auVar132._4_4_;
        auVar39._0_4_ = auVar128._0_4_ * auVar132._0_4_;
        auVar39._8_4_ = auVar128._8_4_ * auVar132._8_4_;
        auVar39._12_4_ = auVar128._12_4_ * auVar132._12_4_;
        auVar39._16_4_ = auVar128._16_4_ * auVar132._16_4_;
        auVar39._20_4_ = auVar128._20_4_ * auVar132._20_4_;
        auVar39._24_4_ = auVar128._24_4_ * auVar132._24_4_;
        auVar39._28_4_ = auVar132._28_4_;
        auVar123 = vfmsub231ps_fma(auVar39,auVar18,auVar114);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar142));
        auVar114 = vmaxps_avx(ZEXT1632(auVar105),ZEXT1632(auVar142));
        auVar114 = vcmpps_avx(auVar114,ZEXT832(0) << 0x20,2);
        auVar106 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar168 = vpand_avx(auVar168,auVar106);
        auVar114 = vpmovsxwd_avx2(auVar168);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0x7f,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0xbf,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar114[0x1f]) {
LAB_015c5a94:
          auVar176._8_8_ = local_5a0[1]._8_8_;
          auVar176._0_8_ = local_5a0[1]._0_8_;
          auVar176._16_8_ = local_5a0[1]._16_8_;
          auVar176._24_8_ = local_5a0[1]._24_8_;
        }
        else {
          auVar40._4_4_ = auVar108._4_4_ * auVar19._4_4_;
          auVar40._0_4_ = auVar108._0_4_ * auVar19._0_4_;
          auVar40._8_4_ = auVar108._8_4_ * auVar19._8_4_;
          auVar40._12_4_ = auVar108._12_4_ * auVar19._12_4_;
          auVar40._16_4_ = auVar108._16_4_ * auVar19._16_4_;
          auVar40._20_4_ = auVar108._20_4_ * auVar19._20_4_;
          auVar40._24_4_ = auVar108._24_4_ * auVar19._24_4_;
          auVar40._28_4_ = auVar114._28_4_;
          auVar124 = vfmsub231ps_fma(auVar40,auVar18,auVar127);
          auVar130._0_4_ = auVar128._0_4_ * auVar127._0_4_;
          auVar130._4_4_ = auVar128._4_4_ * auVar127._4_4_;
          auVar130._8_4_ = auVar128._8_4_ * auVar127._8_4_;
          auVar130._12_4_ = auVar128._12_4_ * auVar127._12_4_;
          auVar130._16_4_ = auVar128._16_4_ * auVar127._16_4_;
          auVar130._20_4_ = auVar128._20_4_ * auVar127._20_4_;
          auVar130._24_4_ = auVar128._24_4_ * auVar127._24_4_;
          auVar130._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar130,auVar20,auVar19);
          auVar41._4_4_ = auVar20._4_4_ * auVar18._4_4_;
          auVar41._0_4_ = auVar20._0_4_ * auVar18._0_4_;
          auVar41._8_4_ = auVar20._8_4_ * auVar18._8_4_;
          auVar41._12_4_ = auVar20._12_4_ * auVar18._12_4_;
          auVar41._16_4_ = auVar20._16_4_ * auVar18._16_4_;
          auVar41._20_4_ = auVar20._20_4_ * auVar18._20_4_;
          auVar41._24_4_ = auVar20._24_4_ * auVar18._24_4_;
          auVar41._28_4_ = auVar20._28_4_;
          auVar155 = vfmsub231ps_fma(auVar41,auVar128,auVar108);
          auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar155));
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar124),_DAT_01faff00);
          auVar114 = vrcpps_avx(ZEXT1632(auVar123));
          auVar209._8_4_ = 0x3f800000;
          auVar209._0_8_ = 0x3f8000003f800000;
          auVar209._12_4_ = 0x3f800000;
          auVar209._16_4_ = 0x3f800000;
          auVar209._20_4_ = 0x3f800000;
          auVar209._24_4_ = 0x3f800000;
          auVar209._28_4_ = 0x3f800000;
          auVar106 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar123),auVar209);
          auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar114,auVar114);
          auVar42._4_4_ = auVar155._4_4_ * auVar221._4_4_;
          auVar42._0_4_ = auVar155._0_4_ * auVar221._0_4_;
          auVar42._8_4_ = auVar155._8_4_ * auVar221._8_4_;
          auVar42._12_4_ = auVar155._12_4_ * auVar221._12_4_;
          auVar42._16_4_ = auVar221._16_4_ * 0.0;
          auVar42._20_4_ = auVar221._20_4_ * 0.0;
          auVar42._24_4_ = auVar221._24_4_ * 0.0;
          auVar42._28_4_ = auVar221._28_4_;
          auVar104 = vfmadd231ps_fma(auVar42,auVar173,ZEXT1632(auVar104));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar124),auVar135);
          fVar212 = auVar106._0_4_;
          fVar213 = auVar106._4_4_;
          fVar214 = auVar106._8_4_;
          fVar215 = auVar106._12_4_;
          auVar43._28_4_ = auVar173._28_4_;
          auVar43._0_28_ =
               ZEXT1628(CONCAT412(fVar215 * auVar104._12_4_,
                                  CONCAT48(fVar214 * auVar104._8_4_,
                                           CONCAT44(fVar213 * auVar104._4_4_,
                                                    fVar212 * auVar104._0_4_))));
          auVar113._4_4_ = uVar95;
          auVar113._0_4_ = uVar95;
          auVar113._8_4_ = uVar95;
          auVar113._12_4_ = uVar95;
          auVar113._16_4_ = uVar95;
          auVar113._20_4_ = uVar95;
          auVar113._24_4_ = uVar95;
          auVar113._28_4_ = uVar95;
          uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar131._4_4_ = uVar101;
          auVar131._0_4_ = uVar101;
          auVar131._8_4_ = uVar101;
          auVar131._12_4_ = uVar101;
          auVar131._16_4_ = uVar101;
          auVar131._20_4_ = uVar101;
          auVar131._24_4_ = uVar101;
          auVar131._28_4_ = uVar101;
          auVar173 = vcmpps_avx(auVar113,auVar43,2);
          auVar221 = vcmpps_avx(auVar43,auVar131,2);
          auVar173 = vandps_avx(auVar221,auVar173);
          auVar106 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
          auVar168 = vpand_avx(auVar168,auVar106);
          auVar173 = vpmovsxwd_avx2(auVar168);
          if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar173 >> 0x7f,0) == '\0') &&
                (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar173 >> 0xbf,0) == '\0') &&
              (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar173[0x1f]) goto LAB_015c5a94;
          auVar173 = vcmpps_avx(ZEXT1632(auVar123),ZEXT832(0) << 0x20,4);
          auVar106 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
          auVar168 = vpand_avx(auVar168,auVar106);
          auVar173 = vpmovsxwd_avx2(auVar168);
          auVar176._8_8_ = local_5a0[1]._8_8_;
          auVar176._0_8_ = local_5a0[1]._0_8_;
          auVar176._16_8_ = local_5a0[1]._16_8_;
          auVar176._24_8_ = local_5a0[1]._24_8_;
          if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar173 >> 0x7f,0) != '\0') ||
                (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar173 >> 0xbf,0) != '\0') ||
              (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar173[0x1f] < '\0') {
            auVar114 = ZEXT1632(CONCAT412(fVar215 * auVar105._12_4_,
                                          CONCAT48(fVar214 * auVar105._8_4_,
                                                   CONCAT44(fVar213 * auVar105._4_4_,
                                                            fVar212 * auVar105._0_4_))));
            auVar132 = ZEXT1632(CONCAT412(fVar215 * auVar142._12_4_,
                                          CONCAT48(fVar214 * auVar142._8_4_,
                                                   CONCAT44(fVar213 * auVar142._4_4_,
                                                            fVar212 * auVar142._0_4_))));
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = 0x3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar175._16_4_ = 0x3f800000;
            auVar175._20_4_ = 0x3f800000;
            auVar175._24_4_ = 0x3f800000;
            auVar175._28_4_ = 0x3f800000;
            auVar221 = vsubps_avx(auVar175,auVar114);
            _local_160 = vblendvps_avx(auVar221,auVar114,auVar22);
            auVar221 = vsubps_avx(auVar175,auVar132);
            local_380 = vblendvps_avx(auVar221,auVar132,auVar22);
            auVar176 = auVar173;
            local_520 = auVar43;
          }
        }
        auVar226 = ZEXT3264(local_760);
        auVar220 = ZEXT3264(_local_620);
        auVar210 = ZEXT3264(local_680);
        auVar159 = ZEXT3264(auVar204);
        auVar140 = ZEXT3264(auVar156);
        if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar176 >> 0x7f,0) == '\0') &&
              (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar176 >> 0xbf,0) == '\0') &&
            (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar176[0x1f]) {
          auVar140 = ZEXT3264(local_660);
          auVar159 = ZEXT3264(local_5c0);
          auVar192 = ZEXT3264(local_740);
        }
        else {
          auVar173 = vsubps_avx(auVar153,auVar174);
          auVar168 = vfmadd213ps_fma(auVar173,_local_160,auVar174);
          fVar212 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar44._4_4_ = (auVar168._4_4_ + auVar168._4_4_) * fVar212;
          auVar44._0_4_ = (auVar168._0_4_ + auVar168._0_4_) * fVar212;
          auVar44._8_4_ = (auVar168._8_4_ + auVar168._8_4_) * fVar212;
          auVar44._12_4_ = (auVar168._12_4_ + auVar168._12_4_) * fVar212;
          auVar44._16_4_ = fVar212 * 0.0;
          auVar44._20_4_ = fVar212 * 0.0;
          auVar44._24_4_ = fVar212 * 0.0;
          auVar44._28_4_ = 0;
          auVar173 = vcmpps_avx(local_520,auVar44,6);
          auVar221 = auVar176 & auVar173;
          auVar192 = ZEXT3264(local_740);
          if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar221 >> 0x7f,0) == '\0') &&
                (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0xbf,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar221[0x1f]) {
            auVar140 = ZEXT3264(local_660);
            auVar159 = ZEXT3264(local_5c0);
          }
          else {
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar152._8_4_ = 0x40000000;
            auVar152._0_8_ = 0x4000000040000000;
            auVar152._12_4_ = 0x40000000;
            auVar152._16_4_ = 0x40000000;
            auVar152._20_4_ = 0x40000000;
            auVar152._24_4_ = 0x40000000;
            auVar152._28_4_ = 0x40000000;
            auVar168 = vfmadd213ps_fma(local_380,auVar152,auVar133);
            local_2a0 = _local_160;
            local_380 = ZEXT1632(auVar168);
            auVar221 = local_380;
            local_280 = ZEXT1632(auVar168);
            local_260 = local_520;
            local_240 = 0;
            local_23c = iVar9;
            local_230 = uVar89;
            uStack_228 = uVar90;
            local_220 = local_7a0;
            uStack_218 = uStack_798;
            local_210 = local_7b0;
            uStack_208 = uStack_7a8;
            local_200 = local_7c0;
            uStack_1f8 = uStack_7b8;
            local_380 = auVar221;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5a0[0] = vandps_avx(auVar173,auVar176);
              fVar212 = 1.0 / auVar109._0_4_;
              local_1c0[0] = fVar212 * ((float)local_160._0_4_ + 0.0);
              local_1c0[1] = fVar212 * ((float)local_160._4_4_ + 1.0);
              local_1c0[2] = fVar212 * (fStack_158 + 2.0);
              local_1c0[3] = fVar212 * (fStack_154 + 3.0);
              fStack_1b0 = fVar212 * (fStack_150 + 4.0);
              fStack_1ac = fVar212 * (fStack_14c + 5.0);
              fStack_1a8 = fVar212 * (fStack_148 + 6.0);
              fStack_1a4 = fStack_144 + 7.0;
              local_380._0_8_ = auVar168._0_8_;
              local_380._8_8_ = auVar168._8_8_;
              local_1a0 = local_380._0_8_;
              uStack_198 = local_380._8_8_;
              uStack_190 = 0;
              uStack_188 = 0;
              local_180 = local_520;
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar173 = vblendvps_avx(auVar134,local_520,local_5a0[0]);
              auVar221 = vshufps_avx(auVar173,auVar173,0xb1);
              auVar221 = vminps_avx(auVar173,auVar221);
              auVar114 = vshufpd_avx(auVar221,auVar221,5);
              auVar221 = vminps_avx(auVar221,auVar114);
              auVar114 = vpermpd_avx2(auVar221,0x4e);
              auVar221 = vminps_avx(auVar221,auVar114);
              auVar221 = vcmpps_avx(auVar173,auVar221,0);
              auVar114 = local_5a0[0] & auVar221;
              auVar173 = local_5a0[0];
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar173 = vandps_avx(auVar221,local_5a0[0]);
              }
              uVar93 = vmovmskps_avx(auVar173);
              uVar95 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                uVar95 = uVar95 + 1;
              }
              uVar94 = (ulong)uVar95;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar212 = local_1c0[uVar94];
                uVar101 = *(undefined4 *)((long)&local_1a0 + uVar94 * 4);
                fVar213 = 1.0 - fVar212;
                auVar165 = ZEXT416((uint)(fVar212 * fVar213 * 4.0));
                auVar168 = vfnmsub213ss_fma(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),auVar165);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),auVar165);
                fVar213 = fVar213 * -fVar213 * 0.5;
                fVar214 = auVar168._0_4_ * 0.5;
                fVar215 = auVar165._0_4_ * 0.5;
                fVar216 = fVar212 * fVar212 * 0.5;
                auVar163._0_4_ = fVar216 * fVar117;
                auVar163._4_4_ = fVar216 * fVar118;
                auVar163._8_4_ = fVar216 * fVar119;
                auVar163._12_4_ = fVar216 * fVar14;
                auVar143._4_4_ = fVar215;
                auVar143._0_4_ = fVar215;
                auVar143._8_4_ = fVar215;
                auVar143._12_4_ = fVar215;
                auVar165 = vfmadd132ps_fma(auVar143,auVar163,auVar17);
                auVar164._4_4_ = fVar214;
                auVar164._0_4_ = fVar214;
                auVar164._8_4_ = fVar214;
                auVar164._12_4_ = fVar214;
                auVar165 = vfmadd132ps_fma(auVar164,auVar165,auVar16);
                auVar144._4_4_ = fVar213;
                auVar144._0_4_ = fVar213;
                auVar144._8_4_ = fVar213;
                auVar144._12_4_ = fVar213;
                auVar165 = vfmadd132ps_fma(auVar144,auVar165,*(undefined1 (*) [16])pPVar1);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar94 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                uVar197 = vextractps_avx(auVar165,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar197;
                uVar197 = vextractps_avx(auVar165,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar197;
                *(float *)(ray + k * 4 + 0xf0) = fVar212;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar101;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x120) = local_7e0._4_4_;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_7e0._0_4_ = local_7e0._4_4_;
                local_7e0._8_4_ = local_7e0._4_4_;
                local_7e0._12_4_ = local_7e0._4_4_;
                local_5e0._0_8_ = CONCAT44(uVar4,uVar4);
                local_5e0 = ZEXT1632(CONCAT412(uVar4,CONCAT48(uVar4,local_5e0._0_8_)));
                local_4e0 = ZEXT1632(*local_6a8);
                auStack_830 = auVar135._16_16_;
                local_840 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_6e0 = auVar156;
                local_6a0 = auVar204;
                while( true ) {
                  auVar135 = _local_840;
                  fVar212 = local_1c0[uVar94];
                  local_400._4_4_ = fVar212;
                  local_400._0_4_ = fVar212;
                  local_400._8_4_ = fVar212;
                  local_400._12_4_ = fVar212;
                  local_3f0 = *(undefined4 *)((long)&local_1a0 + uVar94 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar94 * 4);
                  fVar214 = 1.0 - fVar212;
                  auVar168 = ZEXT416((uint)(fVar212 * fVar214 * 4.0));
                  auVar106 = vfnmsub213ss_fma(local_400,local_400,auVar168);
                  auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),auVar168)
                  ;
                  fVar213 = auVar168._0_4_ * 0.5;
                  fVar212 = fVar212 * fVar212 * 0.5;
                  auVar171._0_4_ = fVar212 * fVar117;
                  auVar171._4_4_ = fVar212 * fVar118;
                  auVar171._8_4_ = fVar212 * fVar119;
                  auVar171._12_4_ = fVar212 * fVar14;
                  auVar149._4_4_ = fVar213;
                  auVar149._0_4_ = fVar213;
                  auVar149._8_4_ = fVar213;
                  auVar149._12_4_ = fVar213;
                  auVar168 = vfmadd132ps_fma(auVar149,auVar171,auVar17);
                  fVar212 = auVar106._0_4_ * 0.5;
                  auVar172._4_4_ = fVar212;
                  auVar172._0_4_ = fVar212;
                  auVar172._8_4_ = fVar212;
                  auVar172._12_4_ = fVar212;
                  auVar168 = vfmadd132ps_fma(auVar172,auVar168,auVar16);
                  local_710.context = context->user;
                  fVar212 = fVar214 * -fVar214 * 0.5;
                  auVar150._4_4_ = fVar212;
                  auVar150._0_4_ = fVar212;
                  auVar150._8_4_ = fVar212;
                  auVar150._12_4_ = fVar212;
                  auVar106 = vfmadd132ps_fma(auVar150,auVar168,auVar165);
                  local_430 = auVar106._0_4_;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  auVar168 = vshufps_avx(auVar106,auVar106,0x55);
                  local_420 = auVar168;
                  local_410 = vshufps_avx(auVar106,auVar106,0xaa);
                  uStack_3ec = local_3f0;
                  uStack_3e8 = local_3f0;
                  uStack_3e4 = local_3f0;
                  local_3e0 = local_5e0._0_8_;
                  uStack_3d8 = local_5e0._8_8_;
                  local_3d0 = local_7e0;
                  vpcmpeqd_avx2(ZEXT1632(local_7e0),ZEXT1632(local_7e0));
                  uStack_3bc = (local_710.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_710.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_790 = local_4e0._0_16_;
                  local_710.valid = (int *)local_790;
                  local_710.geometryUserPtr = *(void **)(CONCAT44(uStack_55c,local_560) + 0x18);
                  local_710.hit = (RTCHitN *)&local_430;
                  local_710.N = 4;
                  pcVar12 = *(code **)(CONCAT44(uStack_55c,local_560) + 0x40);
                  local_710.ray = (RTCRayN *)ray;
                  if (pcVar12 != (code *)0x0) {
                    (*pcVar12)(&local_710);
                    auVar220 = ZEXT3264(_local_620);
                    auVar159 = ZEXT3264(local_6a0);
                    auVar210 = ZEXT3264(local_680);
                    auVar140 = ZEXT3264(local_6e0);
                    auVar226 = ZEXT3264(local_760);
                    auVar192 = ZEXT3264(local_740);
                    pLVar97 = local_778;
                    pre = local_770;
                    pPVar98 = local_768;
                  }
                  if (local_790 == (undefined1  [16])0x0) {
                    auVar168 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar168 = auVar168 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_55c,local_560) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var11)(&local_710);
                      auVar220 = ZEXT3264(_local_620);
                      auVar159 = ZEXT3264(local_6a0);
                      auVar210 = ZEXT3264(local_680);
                      auVar140 = ZEXT3264(local_6e0);
                      auVar226 = ZEXT3264(local_760);
                      auVar192 = ZEXT3264(local_740);
                      pLVar97 = local_778;
                      pre = local_770;
                      pPVar98 = local_768;
                    }
                    auVar106 = vpcmpeqd_avx(local_790,_DAT_01f7aa10);
                    auVar105 = vpcmpeqd_avx(auVar168,auVar168);
                    auVar168 = auVar106 ^ auVar105;
                    if (local_790 != (undefined1  [16])0x0) {
                      auVar106 = auVar106 ^ auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])local_710.hit);
                      *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x10));
                      *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x20));
                      *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x30));
                      *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x40));
                      *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x50));
                      *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x60));
                      *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar105;
                      auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x70));
                      *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar105;
                      auVar106 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x80));
                      *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar106;
                    }
                  }
                  auVar173 = local_520;
                  auVar156 = auVar140._0_32_;
                  auVar204 = auVar159._0_32_;
                  auVar126._8_8_ = 0x100000001;
                  auVar126._0_8_ = 0x100000001;
                  if ((auVar126 & auVar168) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_840._0_4_;
                  }
                  else {
                    local_840._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_840._4_4_ = 0;
                    local_840._8_4_ = 0;
                    local_840._12_4_ = 0;
                  }
                  *(undefined4 *)(local_5a0[0] + uVar94 * 4) = 0;
                  auStack_830 = auVar135._16_16_;
                  auVar116._4_4_ = local_840._0_4_;
                  auVar116._0_4_ = local_840._0_4_;
                  auVar116._8_4_ = local_840._0_4_;
                  auVar116._12_4_ = local_840._0_4_;
                  auVar116._16_4_ = local_840._0_4_;
                  auVar116._20_4_ = local_840._0_4_;
                  auVar116._24_4_ = local_840._0_4_;
                  auVar116._28_4_ = local_840._0_4_;
                  auVar221 = vcmpps_avx(auVar173,auVar116,2);
                  auVar135 = vandps_avx(auVar221,local_5a0[0]);
                  local_5a0[0] = local_5a0[0] & auVar221;
                  if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                        (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                      (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5a0[0][0x1f]) break;
                  auVar139._8_4_ = 0x7f800000;
                  auVar139._0_8_ = 0x7f8000007f800000;
                  auVar139._12_4_ = 0x7f800000;
                  auVar139._16_4_ = 0x7f800000;
                  auVar139._20_4_ = 0x7f800000;
                  auVar139._24_4_ = 0x7f800000;
                  auVar139._28_4_ = 0x7f800000;
                  auVar173 = vblendvps_avx(auVar139,auVar173,auVar135);
                  auVar221 = vshufps_avx(auVar173,auVar173,0xb1);
                  auVar221 = vminps_avx(auVar173,auVar221);
                  auVar114 = vshufpd_avx(auVar221,auVar221,5);
                  auVar221 = vminps_avx(auVar221,auVar114);
                  auVar114 = vpermpd_avx2(auVar221,0x4e);
                  auVar221 = vminps_avx(auVar221,auVar114);
                  auVar221 = vcmpps_avx(auVar173,auVar221,0);
                  auVar114 = auVar135 & auVar221;
                  auVar173 = auVar135;
                  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0x7f,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar114 >> 0xbf,0) != '\0') ||
                      (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar114[0x1f] < '\0') {
                    auVar173 = vandps_avx(auVar221,auVar135);
                  }
                  uVar93 = vmovmskps_avx(auVar173);
                  uVar95 = 0;
                  for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                    uVar95 = uVar95 + 1;
                  }
                  uVar94 = (ulong)uVar95;
                  local_5a0[0] = auVar135;
                }
              }
            }
            auVar140 = ZEXT3264(local_660);
            auVar159 = ZEXT3264(local_5c0);
          }
        }
      }
      if (8 < iVar9) {
        _local_620 = auVar220._0_32_;
        local_680 = auVar210._0_32_;
        local_320._4_4_ = iVar9;
        local_320._0_4_ = iVar9;
        local_320._8_4_ = iVar9;
        local_320._12_4_ = iVar9;
        local_320._16_4_ = iVar9;
        local_320._20_4_ = iVar9;
        local_320._24_4_ = iVar9;
        local_320._28_4_ = iVar9;
        local_360._4_4_ = fVar206;
        local_360._0_4_ = fVar206;
        fStack_358 = fVar206;
        fStack_354 = fVar206;
        fStack_350 = fVar206;
        fStack_34c = fVar206;
        fStack_348 = fVar206;
        fStack_344 = fVar206;
        local_560 = local_600._0_4_;
        uStack_55c = local_600._0_4_;
        uStack_558 = local_600._0_4_;
        uStack_554 = local_600._0_4_;
        uStack_550 = local_600._0_4_;
        uStack_54c = local_600._0_4_;
        uStack_548 = local_600._0_4_;
        uStack_544 = local_600._0_4_;
        local_120 = 1.0 / (float)local_630._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_630._4_4_ = local_7e0._4_4_;
        local_630._0_4_ = local_7e0._4_4_;
        uStack_628 = local_7e0._4_4_;
        uStack_624 = local_7e0._4_4_;
        local_2d0 = uVar4;
        uStack_2cc = uVar4;
        uStack_2c8 = uVar4;
        uStack_2c4 = uVar4;
        lVar99 = 8;
        local_6e0 = auVar156;
        local_6a0 = auVar204;
        do {
          auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar99 * 4 + lVar23);
          auVar173 = *(undefined1 (*) [32])(lVar23 + 0x21aefac + lVar99 * 4);
          auVar221 = *(undefined1 (*) [32])(lVar23 + 0x21af430 + lVar99 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar23 + 0x21af8b4 + lVar99 * 4);
          fVar120 = *(float *)*pauVar2;
          fVar80 = *(float *)(*pauVar2 + 4);
          fVar81 = *(float *)(*pauVar2 + 8);
          fVar121 = *(float *)(*pauVar2 + 0xc);
          fVar141 = *(float *)(*pauVar2 + 0x10);
          fVar177 = *(float *)(*pauVar2 + 0x14);
          fVar185 = *(float *)(*pauVar2 + 0x18);
          auVar92 = *pauVar2;
          auVar211._0_4_ = local_460 * fVar120;
          auVar211._4_4_ = fStack_45c * fVar80;
          auVar211._8_4_ = fStack_458 * fVar81;
          auVar211._12_4_ = fStack_454 * fVar121;
          auVar211._16_4_ = fStack_450 * fVar141;
          auVar211._20_4_ = fStack_44c * fVar177;
          auVar211._28_36_ = auVar210._28_36_;
          auVar211._24_4_ = fStack_448 * fVar185;
          auVar210._0_4_ = (float)local_140 * fVar120;
          auVar210._4_4_ = local_140._4_4_ * fVar80;
          auVar210._8_4_ = (float)uStack_138 * fVar81;
          auVar210._12_4_ = uStack_138._4_4_ * fVar121;
          auVar210._16_4_ = (float)uStack_130 * fVar141;
          auVar210._20_4_ = uStack_130._4_4_ * fVar177;
          auVar210._28_36_ = auVar220._28_36_;
          auVar210._24_4_ = (float)uStack_128 * fVar185;
          auVar165 = vfmadd231ps_fma(auVar211._0_32_,auVar221,auVar140._0_32_);
          auVar168 = vfmadd231ps_fma(auVar210._0_32_,auVar221,auVar159._0_32_);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar173,auVar192._0_32_);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar173,local_4a0);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar135,auVar226._0_32_);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar135,local_480);
          auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar99 * 4 + lVar23);
          auVar132 = *(undefined1 (*) [32])(lVar23 + 0x21b13cc + lVar99 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar23 + 0x21b1850 + lVar99 * 4);
          pfVar3 = (float *)(lVar23 + 0x21b1cd4 + lVar99 * 4);
          fVar82 = *pfVar3;
          fVar83 = pfVar3[1];
          fVar84 = pfVar3[2];
          fVar85 = pfVar3[3];
          fVar86 = pfVar3[4];
          fVar87 = pfVar3[5];
          fVar88 = pfVar3[6];
          auVar79._4_4_ = fVar83 * fStack_45c;
          auVar79._0_4_ = fVar82 * local_460;
          auVar79._8_4_ = fVar84 * fStack_458;
          auVar79._12_4_ = fVar85 * fStack_454;
          auVar79._16_4_ = fVar86 * fStack_450;
          auVar79._20_4_ = fVar87 * fStack_44c;
          auVar79._24_4_ = fVar88 * fStack_448;
          auVar79._28_4_ = fStack_444;
          auVar45._4_4_ = local_140._4_4_ * fVar83;
          auVar45._0_4_ = (float)local_140 * fVar82;
          auVar45._8_4_ = (float)uStack_138 * fVar84;
          auVar45._12_4_ = uStack_138._4_4_ * fVar85;
          auVar45._16_4_ = (float)uStack_130 * fVar86;
          auVar45._20_4_ = uStack_130._4_4_ * fVar87;
          auVar45._24_4_ = (float)uStack_128 * fVar88;
          auVar45._28_4_ = auVar135._28_4_;
          auVar106 = vfmadd231ps_fma(auVar79,auVar7,auVar140._0_32_);
          auVar105 = vfmadd231ps_fma(auVar45,auVar7,auVar159._0_32_);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar132,auVar192._0_32_);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar132,local_4a0);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar114,auVar226._0_32_);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar114,local_480);
          local_4e0 = ZEXT1632(auVar106);
          local_5e0 = ZEXT1632(auVar165);
          auVar108 = vsubps_avx(local_4e0,local_5e0);
          local_300 = ZEXT1632(auVar168);
          local_600 = ZEXT1632(auVar105);
          auVar21 = vsubps_avx(local_600,local_300);
          auVar220 = ZEXT3264(auVar21);
          auVar77._4_4_ = auVar168._4_4_ * auVar108._4_4_;
          auVar77._0_4_ = auVar168._0_4_ * auVar108._0_4_;
          auVar77._8_4_ = auVar168._8_4_ * auVar108._8_4_;
          auVar77._12_4_ = auVar168._12_4_ * auVar108._12_4_;
          auVar77._16_4_ = auVar108._16_4_ * 0.0;
          auVar77._20_4_ = auVar108._20_4_ * 0.0;
          auVar77._24_4_ = auVar108._24_4_ * 0.0;
          auVar77._28_4_ = local_4a0._28_4_;
          fVar206 = auVar21._0_4_;
          auVar159._0_4_ = auVar165._0_4_ * fVar206;
          fVar212 = auVar21._4_4_;
          auVar159._4_4_ = auVar165._4_4_ * fVar212;
          fVar213 = auVar21._8_4_;
          auVar159._8_4_ = auVar165._8_4_ * fVar213;
          fVar214 = auVar21._12_4_;
          auVar159._12_4_ = auVar165._12_4_ * fVar214;
          fVar215 = auVar21._16_4_;
          auVar159._16_4_ = fVar215 * 0.0;
          fVar216 = auVar21._20_4_;
          auVar159._20_4_ = fVar216 * 0.0;
          fVar217 = auVar21._24_4_;
          auVar159._28_36_ = auVar140._28_36_;
          auVar159._24_4_ = fVar217 * 0.0;
          auVar153 = vsubps_avx(auVar77,auVar159._0_32_);
          auVar46._4_4_ = local_e0._4_4_ * fVar80;
          auVar46._0_4_ = (float)local_e0 * fVar120;
          auVar46._8_4_ = (float)uStack_d8 * fVar81;
          auVar46._12_4_ = uStack_d8._4_4_ * fVar121;
          auVar46._16_4_ = (float)uStack_d0 * fVar141;
          auVar46._20_4_ = uStack_d0._4_4_ * fVar177;
          auVar46._24_4_ = (float)uStack_c8 * fVar185;
          auVar46._28_4_ = local_4a0._28_4_;
          auVar165 = vfmadd231ps_fma(auVar46,auVar221,local_c0);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_a0,auVar173);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_80,auVar135);
          auVar47._4_4_ = fVar83 * local_e0._4_4_;
          auVar47._0_4_ = fVar82 * (float)local_e0;
          auVar47._8_4_ = fVar84 * (float)uStack_d8;
          auVar47._12_4_ = fVar85 * uStack_d8._4_4_;
          auVar47._16_4_ = fVar86 * (float)uStack_d0;
          auVar47._20_4_ = fVar87 * uStack_d0._4_4_;
          auVar47._24_4_ = fVar88 * (float)uStack_c8;
          auVar47._28_4_ = uStack_c8._4_4_;
          auVar168 = vfmadd231ps_fma(auVar47,auVar7,local_c0);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar132,local_a0);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar114,local_80);
          auVar48._4_4_ = fVar212 * fVar212;
          auVar48._0_4_ = fVar206 * fVar206;
          auVar48._8_4_ = fVar213 * fVar213;
          auVar48._12_4_ = fVar214 * fVar214;
          auVar48._16_4_ = fVar215 * fVar215;
          auVar48._20_4_ = fVar216 * fVar216;
          auVar48._24_4_ = fVar217 * fVar217;
          auVar48._28_4_ = uStack_128._4_4_;
          auVar106 = vfmadd231ps_fma(auVar48,auVar108,auVar108);
          local_4c0 = ZEXT1632(auVar165);
          auVar195 = vmaxps_avx(local_4c0,ZEXT1632(auVar168));
          fVar206 = auVar195._0_4_ * auVar195._0_4_;
          fVar212 = auVar195._4_4_ * auVar195._4_4_;
          fVar213 = auVar195._8_4_ * auVar195._8_4_;
          fVar214 = auVar195._12_4_ * auVar195._12_4_;
          fVar215 = auVar195._16_4_ * auVar195._16_4_;
          fVar216 = auVar195._20_4_ * auVar195._20_4_;
          fVar217 = auVar195._24_4_ * auVar195._24_4_;
          auVar210 = ZEXT3264(CONCAT428(auVar195._28_4_,
                                        CONCAT424(fVar217,CONCAT420(fVar216,CONCAT416(fVar215,
                                                  CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(
                                                  fVar212,fVar206))))))));
          auVar200._0_4_ = fVar206 * auVar106._0_4_;
          auVar200._4_4_ = fVar212 * auVar106._4_4_;
          auVar200._8_4_ = fVar213 * auVar106._8_4_;
          auVar200._12_4_ = fVar214 * auVar106._12_4_;
          auVar200._16_4_ = fVar215 * 0.0;
          auVar200._20_4_ = fVar216 * 0.0;
          auVar200._24_4_ = fVar217 * 0.0;
          auVar200._28_4_ = 0;
          auVar49._4_4_ = auVar153._4_4_ * auVar153._4_4_;
          auVar49._0_4_ = auVar153._0_4_ * auVar153._0_4_;
          auVar49._8_4_ = auVar153._8_4_ * auVar153._8_4_;
          auVar49._12_4_ = auVar153._12_4_ * auVar153._12_4_;
          auVar49._16_4_ = auVar153._16_4_ * auVar153._16_4_;
          auVar49._20_4_ = auVar153._20_4_ * auVar153._20_4_;
          auVar49._24_4_ = auVar153._24_4_ * auVar153._24_4_;
          auVar49._28_4_ = auVar153._28_4_;
          auVar195 = vcmpps_avx(auVar49,auVar200,2);
          local_240 = (int)lVar99;
          auVar201._4_4_ = local_240;
          auVar201._0_4_ = local_240;
          auVar201._8_4_ = local_240;
          auVar201._12_4_ = local_240;
          auVar201._16_4_ = local_240;
          auVar201._20_4_ = local_240;
          auVar201._24_4_ = local_240;
          auVar201._28_4_ = local_240;
          auVar153 = vpor_avx2(auVar201,_DAT_01fe9900);
          auVar22 = vpcmpgtd_avx2(local_320,auVar153);
          auVar153 = auVar22 & auVar195;
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0x7f,0) == '\0') &&
                (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar153 >> 0xbf,0) == '\0') &&
              (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar153[0x1f]) {
            auVar140 = ZEXT3264(local_660);
            auVar192 = ZEXT3264(local_740);
            auVar226 = ZEXT3264(local_760);
          }
          else {
            local_340 = vandps_avx(auVar22,auVar195);
            auVar50._4_4_ = (float)local_620._4_4_ * fVar83;
            auVar50._0_4_ = (float)local_620._0_4_ * fVar82;
            auVar50._8_4_ = fStack_618 * fVar84;
            auVar50._12_4_ = fStack_614 * fVar85;
            auVar50._16_4_ = fStack_610 * fVar86;
            auVar50._20_4_ = fStack_60c * fVar87;
            auVar50._24_4_ = fStack_608 * fVar88;
            auVar50._28_4_ = auVar195._28_4_;
            auVar165 = vfmadd213ps_fma(auVar7,local_6a0,auVar50);
            auVar165 = vfmadd213ps_fma(auVar132,local_680,ZEXT1632(auVar165));
            auVar165 = vfmadd213ps_fma(auVar114,local_6e0,ZEXT1632(auVar165));
            local_500._0_4_ = auVar92._0_4_;
            local_500._4_4_ = auVar92._4_4_;
            fStack_4f8 = auVar92._8_4_;
            fStack_4f4 = auVar92._12_4_;
            fStack_4f0 = auVar92._16_4_;
            fStack_4ec = auVar92._20_4_;
            fStack_4e8 = auVar92._24_4_;
            auVar51._4_4_ = (float)local_620._4_4_ * (float)local_500._4_4_;
            auVar51._0_4_ = (float)local_620._0_4_ * (float)local_500._0_4_;
            auVar51._8_4_ = fStack_618 * fStack_4f8;
            auVar51._12_4_ = fStack_614 * fStack_4f4;
            auVar51._16_4_ = fStack_610 * fStack_4f0;
            auVar51._20_4_ = fStack_60c * fStack_4ec;
            auVar51._24_4_ = fStack_608 * fStack_4e8;
            auVar51._28_4_ = auVar195._28_4_;
            auVar106 = vfmadd213ps_fma(auVar221,local_6a0,auVar51);
            auVar106 = vfmadd213ps_fma(auVar173,local_680,ZEXT1632(auVar106));
            auVar173 = *(undefined1 (*) [32])(lVar23 + 0x21afd38 + lVar99 * 4);
            auVar221 = *(undefined1 (*) [32])(lVar23 + 0x21b01bc + lVar99 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar23 + 0x21b0640 + lVar99 * 4);
            pfVar3 = (float *)(lVar23 + 0x21b0ac4 + lVar99 * 4);
            fVar206 = *pfVar3;
            fVar212 = pfVar3[1];
            fVar213 = pfVar3[2];
            fVar214 = pfVar3[3];
            fVar215 = pfVar3[4];
            fVar216 = pfVar3[5];
            fVar217 = pfVar3[6];
            auVar52._4_4_ = fVar212 * fStack_45c;
            auVar52._0_4_ = fVar206 * local_460;
            auVar52._8_4_ = fVar213 * fStack_458;
            auVar52._12_4_ = fVar214 * fStack_454;
            auVar52._16_4_ = fVar215 * fStack_450;
            auVar52._20_4_ = fVar216 * fStack_44c;
            auVar52._24_4_ = fVar217 * fStack_448;
            auVar52._28_4_ = local_6a0._28_4_;
            auVar53._4_4_ = local_140._4_4_ * fVar212;
            auVar53._0_4_ = (float)local_140 * fVar206;
            auVar53._8_4_ = (float)uStack_138 * fVar213;
            auVar53._12_4_ = uStack_138._4_4_ * fVar214;
            auVar53._16_4_ = (float)uStack_130 * fVar215;
            auVar53._20_4_ = uStack_130._4_4_ * fVar216;
            uVar101 = auVar21._28_4_;
            auVar53._24_4_ = (float)uStack_128 * fVar217;
            auVar53._28_4_ = uVar101;
            auVar54._4_4_ = (float)local_620._4_4_ * fVar212;
            auVar54._0_4_ = (float)local_620._0_4_ * fVar206;
            auVar54._8_4_ = fStack_618 * fVar213;
            auVar54._12_4_ = fStack_614 * fVar214;
            auVar54._16_4_ = fStack_610 * fVar215;
            auVar54._20_4_ = fStack_60c * fVar216;
            auVar54._24_4_ = fStack_608 * fVar217;
            auVar54._28_4_ = pfVar3[7];
            auVar142 = vfmadd231ps_fma(auVar52,auVar114,local_660);
            auVar123 = vfmadd231ps_fma(auVar53,auVar114,local_5c0);
            auVar104 = vfmadd231ps_fma(auVar54,local_6a0,auVar114);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar221,local_740);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar221,local_4a0);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_680,auVar221);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar173,local_760);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar173,local_480);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_6e0,auVar173);
            pfVar3 = (float *)(lVar23 + 0x21b2ee4 + lVar99 * 4);
            fVar206 = *pfVar3;
            fVar212 = pfVar3[1];
            fVar213 = pfVar3[2];
            fVar214 = pfVar3[3];
            fVar215 = pfVar3[4];
            fVar216 = pfVar3[5];
            fVar217 = pfVar3[6];
            auVar55._4_4_ = fStack_45c * fVar212;
            auVar55._0_4_ = local_460 * fVar206;
            auVar55._8_4_ = fStack_458 * fVar213;
            auVar55._12_4_ = fStack_454 * fVar214;
            auVar55._16_4_ = fStack_450 * fVar215;
            auVar55._20_4_ = fStack_44c * fVar216;
            auVar55._24_4_ = fStack_448 * fVar217;
            auVar55._28_4_ = uStack_604;
            auVar56._4_4_ = local_140._4_4_ * fVar212;
            auVar56._0_4_ = (float)local_140 * fVar206;
            auVar56._8_4_ = (float)uStack_138 * fVar213;
            auVar56._12_4_ = uStack_138._4_4_ * fVar214;
            auVar56._16_4_ = (float)uStack_130 * fVar215;
            auVar56._20_4_ = uStack_130._4_4_ * fVar216;
            auVar56._24_4_ = (float)uStack_128 * fVar217;
            auVar56._28_4_ = local_6e0._28_4_;
            auVar57._4_4_ = fVar212 * (float)local_620._4_4_;
            auVar57._0_4_ = fVar206 * (float)local_620._0_4_;
            auVar57._8_4_ = fVar213 * fStack_618;
            auVar57._12_4_ = fVar214 * fStack_614;
            auVar57._16_4_ = fVar215 * fStack_610;
            auVar57._20_4_ = fVar216 * fStack_60c;
            auVar57._24_4_ = fVar217 * fStack_608;
            auVar57._28_4_ = pfVar3[7];
            auVar173 = *(undefined1 (*) [32])(lVar23 + 0x21b2a60 + lVar99 * 4);
            auVar124 = vfmadd231ps_fma(auVar55,auVar173,local_660);
            auVar155 = vfmadd231ps_fma(auVar56,auVar173,local_5c0);
            auVar161 = vfmadd231ps_fma(auVar57,auVar173,local_6a0);
            auVar173 = *(undefined1 (*) [32])(lVar23 + 0x21b25dc + lVar99 * 4);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar173,local_740);
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar173,local_4a0);
            auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar173,local_680);
            auVar173 = *(undefined1 (*) [32])(lVar23 + 0x21b2158 + lVar99 * 4);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar173,local_760);
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar173,local_480);
            auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),local_6e0,auVar173);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar202._16_4_ = 0x7fffffff;
            auVar202._20_4_ = 0x7fffffff;
            auVar202._24_4_ = 0x7fffffff;
            auVar202._28_4_ = 0x7fffffff;
            auVar173 = vandps_avx(ZEXT1632(auVar142),auVar202);
            auVar221 = vandps_avx(ZEXT1632(auVar123),auVar202);
            auVar221 = vmaxps_avx(auVar173,auVar221);
            auVar173 = vandps_avx(ZEXT1632(auVar104),auVar202);
            auVar173 = vmaxps_avx(auVar221,auVar173);
            auVar173 = vcmpps_avx(auVar173,_local_360,1);
            auVar114 = vblendvps_avx(ZEXT1632(auVar142),auVar108,auVar173);
            auVar132 = vblendvps_avx(ZEXT1632(auVar123),auVar21,auVar173);
            auVar173 = vandps_avx(ZEXT1632(auVar124),auVar202);
            auVar221 = vandps_avx(ZEXT1632(auVar155),auVar202);
            auVar221 = vmaxps_avx(auVar173,auVar221);
            auVar173 = vandps_avx(auVar202,ZEXT1632(auVar161));
            auVar173 = vmaxps_avx(auVar221,auVar173);
            auVar221 = vcmpps_avx(auVar173,_local_360,1);
            auVar173 = vblendvps_avx(ZEXT1632(auVar124),auVar108,auVar221);
            auVar221 = vblendvps_avx(ZEXT1632(auVar155),auVar21,auVar221);
            auVar106 = vfmadd213ps_fma(auVar135,local_6e0,ZEXT1632(auVar106));
            auVar142 = vfmadd213ps_fma(auVar114,auVar114,ZEXT832(0) << 0x20);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar132,auVar132);
            auVar135 = vrsqrtps_avx(ZEXT1632(auVar142));
            fVar206 = auVar135._0_4_;
            fVar212 = auVar135._4_4_;
            fVar213 = auVar135._8_4_;
            fVar214 = auVar135._12_4_;
            fVar215 = auVar135._16_4_;
            fVar216 = auVar135._20_4_;
            fVar217 = auVar135._24_4_;
            auVar58._4_4_ = fVar212 * fVar212 * fVar212 * auVar142._4_4_ * -0.5;
            auVar58._0_4_ = fVar206 * fVar206 * fVar206 * auVar142._0_4_ * -0.5;
            auVar58._8_4_ = fVar213 * fVar213 * fVar213 * auVar142._8_4_ * -0.5;
            auVar58._12_4_ = fVar214 * fVar214 * fVar214 * auVar142._12_4_ * -0.5;
            auVar58._16_4_ = fVar215 * fVar215 * fVar215 * -0.0;
            auVar58._20_4_ = fVar216 * fVar216 * fVar216 * -0.0;
            auVar58._24_4_ = fVar217 * fVar217 * fVar217 * -0.0;
            auVar58._28_4_ = 0;
            auVar225._8_4_ = 0x3fc00000;
            auVar225._0_8_ = 0x3fc000003fc00000;
            auVar225._12_4_ = 0x3fc00000;
            auVar225._16_4_ = 0x3fc00000;
            auVar225._20_4_ = 0x3fc00000;
            auVar225._24_4_ = 0x3fc00000;
            auVar225._28_4_ = 0x3fc00000;
            auVar142 = vfmadd231ps_fma(auVar58,auVar225,auVar135);
            fVar206 = auVar142._0_4_;
            fVar212 = auVar142._4_4_;
            auVar59._4_4_ = auVar132._4_4_ * fVar212;
            auVar59._0_4_ = auVar132._0_4_ * fVar206;
            fVar213 = auVar142._8_4_;
            auVar59._8_4_ = auVar132._8_4_ * fVar213;
            fVar214 = auVar142._12_4_;
            auVar59._12_4_ = auVar132._12_4_ * fVar214;
            auVar59._16_4_ = auVar132._16_4_ * 0.0;
            auVar59._20_4_ = auVar132._20_4_ * 0.0;
            auVar59._24_4_ = auVar132._24_4_ * 0.0;
            auVar59._28_4_ = auVar135._28_4_;
            auVar60._4_4_ = fVar212 * -auVar114._4_4_;
            auVar60._0_4_ = fVar206 * -auVar114._0_4_;
            auVar60._8_4_ = fVar213 * -auVar114._8_4_;
            auVar60._12_4_ = fVar214 * -auVar114._12_4_;
            auVar60._16_4_ = -auVar114._16_4_ * 0.0;
            auVar60._20_4_ = -auVar114._20_4_ * 0.0;
            auVar60._24_4_ = -auVar114._24_4_ * 0.0;
            auVar60._28_4_ = auVar132._28_4_;
            auVar142 = vfmadd213ps_fma(auVar173,auVar173,ZEXT832(0) << 0x20);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar221,auVar221);
            auVar135 = vrsqrtps_avx(ZEXT1632(auVar142));
            auVar61._28_4_ = uVar101;
            auVar61._0_28_ =
                 ZEXT1628(CONCAT412(fVar214 * 0.0,
                                    CONCAT48(fVar213 * 0.0,CONCAT44(fVar212 * 0.0,fVar206 * 0.0))));
            fVar206 = auVar135._0_4_;
            fVar212 = auVar135._4_4_;
            fVar213 = auVar135._8_4_;
            fVar214 = auVar135._12_4_;
            fVar215 = auVar135._16_4_;
            fVar216 = auVar135._20_4_;
            fVar217 = auVar135._24_4_;
            auVar62._4_4_ = fVar212 * fVar212 * fVar212 * auVar142._4_4_ * -0.5;
            auVar62._0_4_ = fVar206 * fVar206 * fVar206 * auVar142._0_4_ * -0.5;
            auVar62._8_4_ = fVar213 * fVar213 * fVar213 * auVar142._8_4_ * -0.5;
            auVar62._12_4_ = fVar214 * fVar214 * fVar214 * auVar142._12_4_ * -0.5;
            auVar62._16_4_ = fVar215 * fVar215 * fVar215 * -0.0;
            auVar62._20_4_ = fVar216 * fVar216 * fVar216 * -0.0;
            auVar62._24_4_ = fVar217 * fVar217 * fVar217 * -0.0;
            auVar62._28_4_ = 0;
            auVar142 = vfmadd231ps_fma(auVar62,auVar225,auVar135);
            fVar206 = auVar142._0_4_;
            fVar212 = auVar142._4_4_;
            auVar63._4_4_ = auVar221._4_4_ * fVar212;
            auVar63._0_4_ = auVar221._0_4_ * fVar206;
            fVar213 = auVar142._8_4_;
            auVar63._8_4_ = auVar221._8_4_ * fVar213;
            fVar214 = auVar142._12_4_;
            auVar63._12_4_ = auVar221._12_4_ * fVar214;
            auVar63._16_4_ = auVar221._16_4_ * 0.0;
            auVar63._20_4_ = auVar221._20_4_ * 0.0;
            auVar63._24_4_ = auVar221._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar64._4_4_ = fVar212 * -auVar173._4_4_;
            auVar64._0_4_ = fVar206 * -auVar173._0_4_;
            auVar64._8_4_ = fVar213 * -auVar173._8_4_;
            auVar64._12_4_ = fVar214 * -auVar173._12_4_;
            auVar64._16_4_ = -auVar173._16_4_ * 0.0;
            auVar64._20_4_ = -auVar173._20_4_ * 0.0;
            auVar64._24_4_ = -auVar173._24_4_ * 0.0;
            auVar64._28_4_ = auVar135._28_4_;
            auVar65._28_4_ = 0xbf000000;
            auVar65._0_28_ =
                 ZEXT1628(CONCAT412(fVar214 * 0.0,
                                    CONCAT48(fVar213 * 0.0,CONCAT44(fVar212 * 0.0,fVar206 * 0.0))));
            auVar142 = vfmadd213ps_fma(auVar59,local_4c0,local_5e0);
            auVar123 = vfmadd213ps_fma(auVar60,local_4c0,local_300);
            auVar104 = vfmadd213ps_fma(auVar61,local_4c0,ZEXT1632(auVar106));
            auVar103 = vfnmadd213ps_fma(auVar59,local_4c0,local_5e0);
            auVar124 = vfmadd213ps_fma(auVar63,ZEXT1632(auVar168),local_4e0);
            auVar122 = vfnmadd213ps_fma(auVar60,local_4c0,local_300);
            auVar135 = ZEXT1632(auVar168);
            auVar155 = vfmadd213ps_fma(auVar64,auVar135,local_600);
            auVar179 = vfnmadd231ps_fma(ZEXT1632(auVar106),local_4c0,auVar61);
            auVar106 = vfmadd213ps_fma(auVar65,auVar135,ZEXT1632(auVar165));
            auVar160 = vfnmadd213ps_fma(auVar63,auVar135,local_4e0);
            auVar178 = vfnmadd213ps_fma(auVar64,auVar135,local_600);
            auVar180 = vfnmadd231ps_fma(ZEXT1632(auVar165),ZEXT1632(auVar168),auVar65);
            auVar135 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar122));
            auVar173 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar179));
            auVar66._4_4_ = auVar135._4_4_ * auVar179._4_4_;
            auVar66._0_4_ = auVar135._0_4_ * auVar179._0_4_;
            auVar66._8_4_ = auVar135._8_4_ * auVar179._8_4_;
            auVar66._12_4_ = auVar135._12_4_ * auVar179._12_4_;
            auVar66._16_4_ = auVar135._16_4_ * 0.0;
            auVar66._20_4_ = auVar135._20_4_ * 0.0;
            auVar66._24_4_ = auVar135._24_4_ * 0.0;
            auVar66._28_4_ = uVar101;
            auVar161 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar122),auVar173);
            auVar67._4_4_ = auVar103._4_4_ * auVar173._4_4_;
            auVar67._0_4_ = auVar103._0_4_ * auVar173._0_4_;
            auVar67._8_4_ = auVar103._8_4_ * auVar173._8_4_;
            auVar67._12_4_ = auVar103._12_4_ * auVar173._12_4_;
            auVar67._16_4_ = auVar173._16_4_ * 0.0;
            auVar67._20_4_ = auVar173._20_4_ * 0.0;
            auVar67._24_4_ = auVar173._24_4_ * 0.0;
            auVar67._28_4_ = auVar173._28_4_;
            auVar195 = ZEXT1632(auVar103);
            auVar173 = vsubps_avx(ZEXT1632(auVar124),auVar195);
            auVar153 = ZEXT1632(auVar179);
            auVar165 = vfmsub231ps_fma(auVar67,auVar153,auVar173);
            auVar68._4_4_ = auVar122._4_4_ * auVar173._4_4_;
            auVar68._0_4_ = auVar122._0_4_ * auVar173._0_4_;
            auVar68._8_4_ = auVar122._8_4_ * auVar173._8_4_;
            auVar68._12_4_ = auVar122._12_4_ * auVar173._12_4_;
            auVar68._16_4_ = auVar173._16_4_ * 0.0;
            auVar68._20_4_ = auVar173._20_4_ * 0.0;
            auVar68._24_4_ = auVar173._24_4_ * 0.0;
            auVar68._28_4_ = auVar173._28_4_;
            auVar103 = vfmsub231ps_fma(auVar68,auVar195,auVar135);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar161));
            auVar22 = vcmpps_avx(ZEXT1632(auVar165),ZEXT832(0) << 0x20,2);
            auVar135 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar142),auVar22);
            auVar173 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar123),auVar22);
            auVar221 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar104),auVar22);
            auVar220 = ZEXT3264(auVar221);
            auVar114 = vblendvps_avx(auVar195,ZEXT1632(auVar124),auVar22);
            auVar132 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar155),auVar22);
            auVar7 = vblendvps_avx(auVar153,ZEXT1632(auVar106),auVar22);
            auVar195 = vblendvps_avx(ZEXT1632(auVar124),auVar195,auVar22);
            auVar108 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar122),auVar22);
            auVar165 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
            auVar153 = vblendvps_avx(ZEXT1632(auVar106),auVar153,auVar22);
            auVar195 = vsubps_avx(auVar195,auVar135);
            auVar108 = vsubps_avx(auVar108,auVar173);
            auVar20 = vsubps_avx(auVar153,auVar221);
            auVar109 = vsubps_avx(auVar135,auVar114);
            auVar127 = vsubps_avx(auVar173,auVar132);
            auVar210 = ZEXT3264(auVar127);
            auVar128 = vsubps_avx(auVar221,auVar7);
            auVar182._0_4_ = auVar20._0_4_ * auVar135._0_4_;
            auVar182._4_4_ = auVar20._4_4_ * auVar135._4_4_;
            auVar182._8_4_ = auVar20._8_4_ * auVar135._8_4_;
            auVar182._12_4_ = auVar20._12_4_ * auVar135._12_4_;
            auVar182._16_4_ = auVar20._16_4_ * auVar135._16_4_;
            auVar182._20_4_ = auVar20._20_4_ * auVar135._20_4_;
            auVar182._24_4_ = auVar20._24_4_ * auVar135._24_4_;
            auVar182._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar182,auVar221,auVar195);
            auVar69._4_4_ = auVar195._4_4_ * auVar173._4_4_;
            auVar69._0_4_ = auVar195._0_4_ * auVar173._0_4_;
            auVar69._8_4_ = auVar195._8_4_ * auVar173._8_4_;
            auVar69._12_4_ = auVar195._12_4_ * auVar173._12_4_;
            auVar69._16_4_ = auVar195._16_4_ * auVar173._16_4_;
            auVar69._20_4_ = auVar195._20_4_ * auVar173._20_4_;
            auVar69._24_4_ = auVar195._24_4_ * auVar173._24_4_;
            auVar69._28_4_ = auVar153._28_4_;
            auVar142 = vfmsub231ps_fma(auVar69,auVar135,auVar108);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar142),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar183._0_4_ = auVar108._0_4_ * auVar221._0_4_;
            auVar183._4_4_ = auVar108._4_4_ * auVar221._4_4_;
            auVar183._8_4_ = auVar108._8_4_ * auVar221._8_4_;
            auVar183._12_4_ = auVar108._12_4_ * auVar221._12_4_;
            auVar183._16_4_ = auVar108._16_4_ * auVar221._16_4_;
            auVar183._20_4_ = auVar108._20_4_ * auVar221._20_4_;
            auVar183._24_4_ = auVar108._24_4_ * auVar221._24_4_;
            auVar183._28_4_ = 0;
            auVar142 = vfmsub231ps_fma(auVar183,auVar173,auVar20);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar142));
            auVar184._0_4_ = auVar128._0_4_ * auVar114._0_4_;
            auVar184._4_4_ = auVar128._4_4_ * auVar114._4_4_;
            auVar184._8_4_ = auVar128._8_4_ * auVar114._8_4_;
            auVar184._12_4_ = auVar128._12_4_ * auVar114._12_4_;
            auVar184._16_4_ = auVar128._16_4_ * auVar114._16_4_;
            auVar184._20_4_ = auVar128._20_4_ * auVar114._20_4_;
            auVar184._24_4_ = auVar128._24_4_ * auVar114._24_4_;
            auVar184._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar184,auVar109,auVar7);
            auVar70._4_4_ = auVar127._4_4_ * auVar7._4_4_;
            auVar70._0_4_ = auVar127._0_4_ * auVar7._0_4_;
            auVar70._8_4_ = auVar127._8_4_ * auVar7._8_4_;
            auVar70._12_4_ = auVar127._12_4_ * auVar7._12_4_;
            auVar70._16_4_ = auVar127._16_4_ * auVar7._16_4_;
            auVar70._20_4_ = auVar127._20_4_ * auVar7._20_4_;
            auVar70._24_4_ = auVar127._24_4_ * auVar7._24_4_;
            auVar70._28_4_ = auVar7._28_4_;
            auVar123 = vfmsub231ps_fma(auVar70,auVar132,auVar128);
            auVar71._4_4_ = auVar109._4_4_ * auVar132._4_4_;
            auVar71._0_4_ = auVar109._0_4_ * auVar132._0_4_;
            auVar71._8_4_ = auVar109._8_4_ * auVar132._8_4_;
            auVar71._12_4_ = auVar109._12_4_ * auVar132._12_4_;
            auVar71._16_4_ = auVar109._16_4_ * auVar132._16_4_;
            auVar71._20_4_ = auVar109._20_4_ * auVar132._20_4_;
            auVar71._24_4_ = auVar109._24_4_ * auVar132._24_4_;
            auVar71._28_4_ = auVar132._28_4_;
            auVar104 = vfmsub231ps_fma(auVar71,auVar127,auVar114);
            auVar132 = ZEXT832(0) << 0x20;
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar132,ZEXT1632(auVar106));
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar132,ZEXT1632(auVar123));
            auVar114 = vmaxps_avx(ZEXT1632(auVar142),ZEXT1632(auVar123));
            auVar114 = vcmpps_avx(auVar114,ZEXT832(0) << 0x20,2);
            auVar106 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
            auVar165 = vpand_avx(auVar106,auVar165);
            auVar114 = vpmovsxwd_avx2(auVar165);
            if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar114 >> 0x7f,0) == '\0') &&
                  (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0xbf,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar114[0x1f]) {
LAB_015c566c:
              auVar158._8_8_ = local_5a0[1]._8_8_;
              auVar158._0_8_ = local_5a0[1]._0_8_;
              auVar158._16_8_ = local_5a0[1]._16_8_;
              auVar158._24_8_ = local_5a0[1]._24_8_;
            }
            else {
              auVar72._4_4_ = auVar108._4_4_ * auVar128._4_4_;
              auVar72._0_4_ = auVar108._0_4_ * auVar128._0_4_;
              auVar72._8_4_ = auVar108._8_4_ * auVar128._8_4_;
              auVar72._12_4_ = auVar108._12_4_ * auVar128._12_4_;
              auVar72._16_4_ = auVar108._16_4_ * auVar128._16_4_;
              auVar72._20_4_ = auVar108._20_4_ * auVar128._20_4_;
              auVar72._24_4_ = auVar108._24_4_ * auVar128._24_4_;
              auVar72._28_4_ = auVar114._28_4_;
              auVar155 = vfmsub231ps_fma(auVar72,auVar127,auVar20);
              auVar188._0_4_ = auVar109._0_4_ * auVar20._0_4_;
              auVar188._4_4_ = auVar109._4_4_ * auVar20._4_4_;
              auVar188._8_4_ = auVar109._8_4_ * auVar20._8_4_;
              auVar188._12_4_ = auVar109._12_4_ * auVar20._12_4_;
              auVar188._16_4_ = auVar109._16_4_ * auVar20._16_4_;
              auVar188._20_4_ = auVar109._20_4_ * auVar20._20_4_;
              auVar188._24_4_ = auVar109._24_4_ * auVar20._24_4_;
              auVar188._28_4_ = 0;
              auVar124 = vfmsub231ps_fma(auVar188,auVar195,auVar128);
              auVar73._4_4_ = auVar195._4_4_ * auVar127._4_4_;
              auVar73._0_4_ = auVar195._0_4_ * auVar127._0_4_;
              auVar73._8_4_ = auVar195._8_4_ * auVar127._8_4_;
              auVar73._12_4_ = auVar195._12_4_ * auVar127._12_4_;
              auVar73._16_4_ = auVar195._16_4_ * auVar127._16_4_;
              auVar73._20_4_ = auVar195._20_4_ * auVar127._20_4_;
              auVar73._24_4_ = auVar195._24_4_ * auVar127._24_4_;
              auVar73._28_4_ = auVar127._28_4_;
              auVar161 = vfmsub231ps_fma(auVar73,auVar109,auVar108);
              auVar210 = ZEXT1664(auVar161);
              auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar124),ZEXT1632(auVar161));
              auVar104 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar155),auVar132);
              auVar114 = vrcpps_avx(ZEXT1632(auVar104));
              auVar219._8_4_ = 0x3f800000;
              auVar219._0_8_ = 0x3f8000003f800000;
              auVar219._12_4_ = 0x3f800000;
              auVar219._16_4_ = 0x3f800000;
              auVar219._20_4_ = 0x3f800000;
              auVar219._24_4_ = 0x3f800000;
              auVar219._28_4_ = 0x3f800000;
              auVar220 = ZEXT3264(auVar219);
              auVar106 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar104),auVar219);
              auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar114,auVar114);
              auVar74._4_4_ = auVar161._4_4_ * auVar221._4_4_;
              auVar74._0_4_ = auVar161._0_4_ * auVar221._0_4_;
              auVar74._8_4_ = auVar161._8_4_ * auVar221._8_4_;
              auVar74._12_4_ = auVar161._12_4_ * auVar221._12_4_;
              auVar74._16_4_ = auVar221._16_4_ * 0.0;
              auVar74._20_4_ = auVar221._20_4_ * 0.0;
              auVar74._24_4_ = auVar221._24_4_ * 0.0;
              auVar74._28_4_ = auVar20._28_4_;
              auVar124 = vfmadd231ps_fma(auVar74,auVar173,ZEXT1632(auVar124));
              auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),ZEXT1632(auVar155),auVar135);
              fVar206 = auVar106._0_4_;
              fVar212 = auVar106._4_4_;
              fVar213 = auVar106._8_4_;
              fVar214 = auVar106._12_4_;
              auVar114 = ZEXT1632(CONCAT412(fVar214 * auVar124._12_4_,
                                            CONCAT48(fVar213 * auVar124._8_4_,
                                                     CONCAT44(fVar212 * auVar124._4_4_,
                                                              fVar206 * auVar124._0_4_))));
              uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar157._4_4_ = uVar101;
              auVar157._0_4_ = uVar101;
              auVar157._8_4_ = uVar101;
              auVar157._12_4_ = uVar101;
              auVar157._16_4_ = uVar101;
              auVar157._20_4_ = uVar101;
              auVar157._24_4_ = uVar101;
              auVar157._28_4_ = uVar101;
              auVar91._4_4_ = uStack_55c;
              auVar91._0_4_ = local_560;
              auVar91._8_4_ = uStack_558;
              auVar91._12_4_ = uStack_554;
              auVar91._16_4_ = uStack_550;
              auVar91._20_4_ = uStack_54c;
              auVar91._24_4_ = uStack_548;
              auVar91._28_4_ = uStack_544;
              auVar135 = vcmpps_avx(auVar91,auVar114,2);
              auVar173 = vcmpps_avx(auVar114,auVar157,2);
              auVar135 = vandps_avx(auVar173,auVar135);
              auVar106 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
              auVar165 = vpand_avx(auVar165,auVar106);
              auVar135 = vpmovsxwd_avx2(auVar165);
              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar135 >> 0x7f,0) == '\0') &&
                    (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar135 >> 0xbf,0) == '\0') &&
                  (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar135[0x1f]) goto LAB_015c566c;
              auVar135 = vcmpps_avx(ZEXT1632(auVar104),ZEXT832(0) << 0x20,4);
              auVar106 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
              auVar165 = vpand_avx(auVar165,auVar106);
              auVar135 = vpmovsxwd_avx2(auVar165);
              auVar158._8_8_ = local_5a0[1]._8_8_;
              auVar158._0_8_ = local_5a0[1]._0_8_;
              auVar158._16_8_ = local_5a0[1]._16_8_;
              auVar158._24_8_ = local_5a0[1]._24_8_;
              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0x7f,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar135 >> 0xbf,0) != '\0') ||
                  (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar135[0x1f] < '\0') {
                auVar132 = ZEXT1632(CONCAT412(fVar214 * auVar142._12_4_,
                                              CONCAT48(fVar213 * auVar142._8_4_,
                                                       CONCAT44(fVar212 * auVar142._4_4_,
                                                                fVar206 * auVar142._0_4_))));
                auVar75._28_4_ = SUB84(local_5a0[1]._24_8_,4);
                auVar75._0_28_ =
                     ZEXT1628(CONCAT412(fVar214 * auVar123._12_4_,
                                        CONCAT48(fVar213 * auVar123._8_4_,
                                                 CONCAT44(fVar212 * auVar123._4_4_,
                                                          fVar206 * auVar123._0_4_))));
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = 0x3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar196._16_4_ = 0x3f800000;
                auVar196._20_4_ = 0x3f800000;
                auVar196._24_4_ = 0x3f800000;
                auVar196._28_4_ = 0x3f800000;
                auVar173 = vsubps_avx(auVar196,auVar132);
                local_100 = vblendvps_avx(auVar173,auVar132,auVar22);
                auVar173 = vsubps_avx(auVar196,auVar75);
                local_3a0 = vblendvps_avx(auVar173,auVar75,auVar22);
                auVar158 = auVar135;
                local_540 = auVar114;
              }
            }
            auVar226 = ZEXT3264(local_760);
            if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar158 >> 0x7f,0) == '\0') &&
                  (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar158 >> 0xbf,0) == '\0') &&
                (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar158[0x1f]) {
              auVar140 = ZEXT3264(local_660);
              auVar192 = ZEXT3264(local_740);
            }
            else {
              auVar135 = vsubps_avx(ZEXT1632(auVar168),local_4c0);
              auVar165 = vfmadd213ps_fma(auVar135,local_100,local_4c0);
              fVar206 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar76._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar206;
              auVar76._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar206;
              auVar76._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar206;
              auVar76._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar206;
              auVar76._16_4_ = fVar206 * 0.0;
              auVar76._20_4_ = fVar206 * 0.0;
              auVar76._24_4_ = fVar206 * 0.0;
              auVar76._28_4_ = fVar206;
              auVar135 = vcmpps_avx(local_540,auVar76,6);
              auVar173 = auVar158 & auVar135;
              auVar192 = ZEXT3264(local_740);
              if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar173 >> 0x7f,0) != '\0') ||
                    (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar173 >> 0xbf,0) != '\0') ||
                  (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar173[0x1f] < '\0') {
                auVar136._8_4_ = 0xbf800000;
                auVar136._0_8_ = 0xbf800000bf800000;
                auVar136._12_4_ = 0xbf800000;
                auVar136._16_4_ = 0xbf800000;
                auVar136._20_4_ = 0xbf800000;
                auVar136._24_4_ = 0xbf800000;
                auVar136._28_4_ = 0xbf800000;
                auVar154._8_4_ = 0x40000000;
                auVar154._0_8_ = 0x4000000040000000;
                auVar154._12_4_ = 0x40000000;
                auVar154._16_4_ = 0x40000000;
                auVar154._20_4_ = 0x40000000;
                auVar154._24_4_ = 0x40000000;
                auVar154._28_4_ = 0x40000000;
                auVar165 = vfmadd213ps_fma(local_3a0,auVar154,auVar136);
                local_2a0 = local_100;
                local_3a0 = ZEXT1632(auVar165);
                auVar173 = local_3a0;
                local_280 = ZEXT1632(auVar165);
                local_260 = local_540;
                local_23c = iVar9;
                local_230 = uVar89;
                uStack_228 = uVar90;
                local_220 = local_7a0;
                uStack_218 = uStack_798;
                local_210 = local_7b0;
                uStack_208 = uStack_7a8;
                local_200 = local_7c0;
                uStack_1f8 = uStack_7b8;
                pGVar10 = (context->scene->geometries).items[(uint)local_7e0._4_4_].ptr;
                local_3a0 = auVar173;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5a0[0] = vandps_avx(auVar135,auVar158);
                  fVar206 = (float)local_240;
                  local_1c0[0] = (fVar206 + local_100._0_4_ + 0.0) * local_120;
                  local_1c0[1] = (fVar206 + local_100._4_4_ + 1.0) * fStack_11c;
                  local_1c0[2] = (fVar206 + local_100._8_4_ + 2.0) * fStack_118;
                  local_1c0[3] = (fVar206 + local_100._12_4_ + 3.0) * fStack_114;
                  fStack_1b0 = (fVar206 + local_100._16_4_ + 4.0) * fStack_110;
                  fStack_1ac = (fVar206 + local_100._20_4_ + 5.0) * fStack_10c;
                  fStack_1a8 = (fVar206 + local_100._24_4_ + 6.0) * fStack_108;
                  fStack_1a4 = fVar206 + local_100._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar165._0_8_;
                  local_3a0._8_8_ = auVar165._8_8_;
                  local_1a0 = local_3a0._0_8_;
                  uStack_198 = local_3a0._8_8_;
                  uStack_190 = 0;
                  uStack_188 = 0;
                  local_180 = local_540;
                  auVar137._8_4_ = 0x7f800000;
                  auVar137._0_8_ = 0x7f8000007f800000;
                  auVar137._12_4_ = 0x7f800000;
                  auVar137._16_4_ = 0x7f800000;
                  auVar137._20_4_ = 0x7f800000;
                  auVar137._24_4_ = 0x7f800000;
                  auVar137._28_4_ = 0x7f800000;
                  auVar135 = vblendvps_avx(auVar137,local_540,local_5a0[0]);
                  auVar173 = vshufps_avx(auVar135,auVar135,0xb1);
                  auVar173 = vminps_avx(auVar135,auVar173);
                  auVar114 = vshufpd_avx(auVar173,auVar173,5);
                  auVar173 = vminps_avx(auVar173,auVar114);
                  auVar114 = vpermpd_avx2(auVar173,0x4e);
                  auVar173 = vminps_avx(auVar173,auVar114);
                  auVar173 = vcmpps_avx(auVar135,auVar173,0);
                  auVar114 = local_5a0[0] & auVar173;
                  auVar135 = local_5a0[0];
                  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0x7f,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar114 >> 0xbf,0) != '\0') ||
                      (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar114[0x1f] < '\0') {
                    auVar135 = vandps_avx(auVar173,local_5a0[0]);
                  }
                  uVar93 = vmovmskps_avx(auVar135);
                  uVar95 = 0;
                  for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                    uVar95 = uVar95 + 1;
                  }
                  uVar94 = (ulong)uVar95;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar206 = local_1c0[uVar94];
                    uVar101 = *(undefined4 *)((long)&local_1a0 + uVar94 * 4);
                    fVar212 = 1.0 - fVar206;
                    auVar165 = ZEXT416((uint)(fVar206 * fVar212 * 4.0));
                    auVar168 = vfnmsub213ss_fma(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),
                                                auVar165);
                    auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),
                                               auVar165);
                    fVar212 = fVar212 * -fVar212 * 0.5;
                    fVar213 = auVar168._0_4_ * 0.5;
                    fVar214 = auVar165._0_4_ * 0.5;
                    fVar215 = fVar206 * fVar206 * 0.5;
                    auVar166._0_4_ = fVar215 * fVar117;
                    auVar166._4_4_ = fVar215 * fVar118;
                    auVar166._8_4_ = fVar215 * fVar119;
                    auVar166._12_4_ = fVar215 * fVar14;
                    auVar145._4_4_ = fVar214;
                    auVar145._0_4_ = fVar214;
                    auVar145._8_4_ = fVar214;
                    auVar145._12_4_ = fVar214;
                    auVar165 = vfmadd132ps_fma(auVar145,auVar166,auVar17);
                    auVar167._4_4_ = fVar213;
                    auVar167._0_4_ = fVar213;
                    auVar167._8_4_ = fVar213;
                    auVar167._12_4_ = fVar213;
                    auVar165 = vfmadd132ps_fma(auVar167,auVar165,auVar16);
                    auVar146._4_4_ = fVar212;
                    auVar146._0_4_ = fVar212;
                    auVar146._8_4_ = fVar212;
                    auVar146._12_4_ = fVar212;
                    auVar165 = vfmadd132ps_fma(auVar146,auVar165,auVar13);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar94 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                    uVar197 = vextractps_avx(auVar165,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar197;
                    uVar197 = vextractps_avx(auVar165,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar197;
                    *(float *)(ray + k * 4 + 0xf0) = fVar206;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar101;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x120) = local_7e0._4_4_;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_600 = ZEXT1632(CONCAT88(auVar105._8_8_,lVar99));
                    auVar165 = *local_6a8;
                    auStack_830 = auVar221._16_16_;
                    local_840 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    _local_500 = auVar21;
                    while( true ) {
                      auVar135 = _local_840;
                      fVar206 = local_1c0[uVar94];
                      local_400._4_4_ = fVar206;
                      local_400._0_4_ = fVar206;
                      local_400._8_4_ = fVar206;
                      local_400._12_4_ = fVar206;
                      local_3f0 = *(undefined4 *)((long)&local_1a0 + uVar94 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar94 * 4);
                      fVar213 = 1.0 - fVar206;
                      auVar168 = ZEXT416((uint)(fVar206 * fVar213 * 4.0));
                      auVar106 = vfnmsub213ss_fma(local_400,local_400,auVar168);
                      auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),
                                                 auVar168);
                      fVar212 = auVar168._0_4_ * 0.5;
                      fVar206 = fVar206 * fVar206 * 0.5;
                      auVar169._0_4_ = fVar206 * fVar117;
                      auVar169._4_4_ = fVar206 * fVar118;
                      auVar169._8_4_ = fVar206 * fVar119;
                      auVar169._12_4_ = fVar206 * fVar14;
                      auVar147._4_4_ = fVar212;
                      auVar147._0_4_ = fVar212;
                      auVar147._8_4_ = fVar212;
                      auVar147._12_4_ = fVar212;
                      auVar168 = vfmadd132ps_fma(auVar147,auVar169,auVar17);
                      fVar206 = auVar106._0_4_ * 0.5;
                      auVar170._4_4_ = fVar206;
                      auVar170._0_4_ = fVar206;
                      auVar170._8_4_ = fVar206;
                      auVar170._12_4_ = fVar206;
                      auVar168 = vfmadd132ps_fma(auVar170,auVar168,auVar16);
                      local_710.context = context->user;
                      fVar206 = fVar213 * -fVar213 * 0.5;
                      auVar148._4_4_ = fVar206;
                      auVar148._0_4_ = fVar206;
                      auVar148._8_4_ = fVar206;
                      auVar148._12_4_ = fVar206;
                      auVar106 = vfmadd132ps_fma(auVar148,auVar168,auVar15);
                      local_430 = auVar106._0_4_;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      auVar168 = vshufps_avx(auVar106,auVar106,0x55);
                      local_420 = auVar168;
                      local_410 = vshufps_avx(auVar106,auVar106,0xaa);
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      local_3e0 = CONCAT44(uStack_2cc,local_2d0);
                      uStack_3d8 = CONCAT44(uStack_2c4,uStack_2c8);
                      local_3d0 = _local_630;
                      vpcmpeqd_avx2(ZEXT1632(_local_630),ZEXT1632(_local_630));
                      uStack_3bc = (local_710.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_710.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_710.valid = (int *)local_790;
                      local_710.geometryUserPtr = pGVar10->userPtr;
                      local_710.hit = (RTCHitN *)&local_430;
                      local_710.N = 4;
                      local_790 = auVar165;
                      local_710.ray = (RTCRayN *)ray;
                      if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        auVar220 = ZEXT1664(auVar220._0_16_);
                        (*pGVar10->intersectionFilterN)(&local_710);
                      }
                      if (local_790 == (undefined1  [16])0x0) {
                        auVar168 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar168 = auVar168 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar210 = ZEXT1664(auVar210._0_16_);
                          auVar220 = ZEXT1664(auVar220._0_16_);
                          (*p_Var11)(&local_710);
                        }
                        auVar106 = vpcmpeqd_avx(local_790,_DAT_01f7aa10);
                        auVar105 = vpcmpeqd_avx(auVar168,auVar168);
                        auVar168 = auVar106 ^ auVar105;
                        if (local_790 != (undefined1  [16])0x0) {
                          auVar106 = auVar106 ^ auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])local_710.hit);
                          *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x10));
                          *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x20));
                          *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x30));
                          *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x40));
                          *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x50));
                          *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x60));
                          *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x70));
                          *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar105;
                          auVar106 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x80));
                          *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar106;
                        }
                      }
                      auVar173 = local_540;
                      auVar125._8_8_ = 0x100000001;
                      auVar125._0_8_ = 0x100000001;
                      if ((auVar125 & auVar168) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_840._0_4_;
                      }
                      else {
                        local_840._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_840._4_4_ = 0;
                        local_840._8_4_ = 0;
                        local_840._12_4_ = 0;
                      }
                      *(undefined4 *)(local_5a0[0] + uVar94 * 4) = 0;
                      auStack_830 = auVar135._16_16_;
                      auVar115._4_4_ = local_840._0_4_;
                      auVar115._0_4_ = local_840._0_4_;
                      auVar115._8_4_ = local_840._0_4_;
                      auVar115._12_4_ = local_840._0_4_;
                      auVar115._16_4_ = local_840._0_4_;
                      auVar115._20_4_ = local_840._0_4_;
                      auVar115._24_4_ = local_840._0_4_;
                      auVar115._28_4_ = local_840._0_4_;
                      auVar221 = vcmpps_avx(auVar173,auVar115,2);
                      auVar135 = vandps_avx(auVar221,local_5a0[0]);
                      local_5a0[0] = local_5a0[0] & auVar221;
                      if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                            (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                          (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_5a0[0][0x1f]) break;
                      auVar138._8_4_ = 0x7f800000;
                      auVar138._0_8_ = 0x7f8000007f800000;
                      auVar138._12_4_ = 0x7f800000;
                      auVar138._16_4_ = 0x7f800000;
                      auVar138._20_4_ = 0x7f800000;
                      auVar138._24_4_ = 0x7f800000;
                      auVar138._28_4_ = 0x7f800000;
                      auVar173 = vblendvps_avx(auVar138,auVar173,auVar135);
                      auVar221 = vshufps_avx(auVar173,auVar173,0xb1);
                      auVar221 = vminps_avx(auVar173,auVar221);
                      auVar114 = vshufpd_avx(auVar221,auVar221,5);
                      auVar221 = vminps_avx(auVar221,auVar114);
                      auVar114 = vpermpd_avx2(auVar221,0x4e);
                      auVar221 = vminps_avx(auVar221,auVar114);
                      auVar221 = vcmpps_avx(auVar173,auVar221,0);
                      auVar114 = auVar135 & auVar221;
                      auVar173 = auVar135;
                      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0xbf,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar114[0x1f] < '\0') {
                        auVar173 = vandps_avx(auVar221,auVar135);
                      }
                      uVar93 = vmovmskps_avx(auVar173);
                      uVar95 = 0;
                      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                        uVar95 = uVar95 + 1;
                      }
                      uVar94 = (ulong)uVar95;
                      local_5a0[0] = auVar135;
                    }
                    auVar192 = ZEXT3264(local_740);
                    auVar226 = ZEXT3264(local_760);
                    pLVar97 = local_778;
                    pre = local_770;
                    pPVar98 = local_768;
                    lVar99 = local_600._0_8_;
                  }
                }
              }
              auVar140 = ZEXT3264(local_660);
            }
          }
          lVar99 = lVar99 + 8;
          auVar159 = ZEXT3264(local_5c0);
        } while ((int)lVar99 < iVar9);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar107._4_4_ = uVar4;
      auVar107._0_4_ = uVar4;
      auVar107._8_4_ = uVar4;
      auVar107._12_4_ = uVar4;
      auVar165 = vcmpps_avx(local_2c0,auVar107,2);
      uVar95 = vmovmskps_avx(auVar165);
      uVar95 = (uint)uVar100 & uVar95;
    } while (uVar95 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }